

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Scene **ppSVar2;
  Primitive *pPVar3;
  undefined1 (*pauVar4) [12];
  Primitive PVar5;
  undefined4 uVar6;
  int iVar7;
  Geometry *pGVar8;
  undefined8 uVar9;
  float *pfVar10;
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined8 uVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  RTCRayN *pRVar36;
  RTCIntersectArguments *pRVar37;
  long lVar38;
  RTCIntersectArguments *pRVar39;
  long lVar40;
  undefined4 uVar41;
  undefined8 unaff_RBP;
  LinearSpace3fa *pLVar43;
  long lVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  float fVar76;
  float fVar78;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar77;
  float fVar79;
  undefined8 uVar80;
  float fVar81;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  undefined1 auVar71 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar74;
  short sVar82;
  float fVar83;
  float fVar122;
  float fVar123;
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  float fVar125;
  float fVar134;
  float fVar136;
  vfloat4 v_1;
  undefined1 auVar126 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar153;
  float fVar156;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar173;
  float fVar175;
  vfloat4 v;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar180;
  float fVar190;
  float fVar191;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar192;
  float fVar193;
  float fVar213;
  float fVar215;
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar224;
  float fVar228;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar223 [16];
  float fVar233;
  float fVar236;
  float fVar237;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar244;
  float fVar245;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [16];
  float fVar262;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  float fVar272;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar273;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar286;
  undefined1 auVar284 [16];
  float fVar287;
  undefined1 auVar285 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar292 [16];
  float fVar306;
  float fVar307;
  undefined4 uStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_458;
  float local_428;
  float fStack_424;
  float fStack_420;
  vbool<4> valid;
  undefined1 local_3f8 [16];
  LinearSpace3fa *local_3e0;
  Primitive *local_3d8;
  RTCIntersectArguments *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  RTCFilterFunctionNArguments args;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar42;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined2 uVar75;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 uVar121;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  
  PVar5 = prim[1];
  uVar33 = (ulong)(byte)PVar5;
  pPVar3 = prim + uVar33 * 0x19 + 6;
  fVar156 = *(float *)(pPVar3 + 0xc);
  uVar41 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar161 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar156;
  fVar173 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar156;
  fVar175 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar156;
  fVar139 = *(float *)(ray + k * 4 + 0x40) * fVar156;
  fVar153 = *(float *)(ray + k * 4 + 0x50) * fVar156;
  fVar156 = *(float *)(ray + k * 4 + 0x60) * fVar156;
  uVar6 = *(undefined4 *)(prim + uVar33 * 4 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar42;
  auVar86._12_2_ = uVar75;
  auVar86._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar42;
  auVar85._10_2_ = uVar75;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar75;
  auVar84._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar12._4_8_ = auVar84._8_8_;
  auVar12._2_2_ = uVar75;
  auVar12._0_2_ = uVar75;
  fVar124 = (float)((int)sVar82 >> 8);
  fVar134 = (float)(auVar12._0_4_ >> 0x18);
  fVar136 = (float)(auVar84._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 5 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar42;
  auVar89._12_2_ = uVar75;
  auVar89._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar42;
  auVar88._10_2_ = uVar75;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar75;
  auVar87._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar13._4_8_ = auVar87._8_8_;
  auVar13._2_2_ = uVar75;
  auVar13._0_2_ = uVar75;
  fVar180 = (float)((int)sVar82 >> 8);
  fVar190 = (float)(auVar13._0_4_ >> 0x18);
  fVar191 = (float)(auVar87._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 6 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar42;
  auVar92._12_2_ = uVar75;
  auVar92._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar42;
  auVar91._10_2_ = uVar75;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar75;
  auVar90._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar14._4_8_ = auVar90._8_8_;
  auVar14._2_2_ = uVar75;
  auVar14._0_2_ = uVar75;
  fVar233 = (float)((int)sVar82 >> 8);
  fVar236 = (float)(auVar14._0_4_ >> 0x18);
  fVar237 = (float)(auVar90._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0xb + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar42;
  auVar95._12_2_ = uVar75;
  auVar95._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar42;
  auVar94._10_2_ = uVar75;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar75;
  auVar93._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar15._4_8_ = auVar93._8_8_;
  auVar15._2_2_ = uVar75;
  auVar15._0_2_ = uVar75;
  fVar238 = (float)((int)sVar82 >> 8);
  fVar241 = (float)(auVar15._0_4_ >> 0x18);
  fVar243 = (float)(auVar93._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0xc + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar42;
  auVar196._12_2_ = uVar75;
  auVar196._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar42;
  auVar195._10_2_ = uVar75;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar75;
  auVar194._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar16._4_8_ = auVar194._8_8_;
  auVar16._2_2_ = uVar75;
  auVar16._0_2_ = uVar75;
  fVar218 = (float)((int)sVar82 >> 8);
  fVar224 = (float)(auVar16._0_4_ >> 0x18);
  fVar228 = (float)(auVar194._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0xd + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar42;
  auVar199._12_2_ = uVar75;
  auVar199._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar42;
  auVar198._10_2_ = uVar75;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar75;
  auVar197._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar17._4_8_ = auVar197._8_8_;
  auVar17._2_2_ = uVar75;
  auVar17._0_2_ = uVar75;
  fVar244 = (float)((int)sVar82 >> 8);
  fVar249 = (float)(auVar17._0_4_ >> 0x18);
  fVar251 = (float)(auVar197._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0x12 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar42;
  auVar202._12_2_ = uVar75;
  auVar202._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar42;
  auVar201._10_2_ = uVar75;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar75;
  auVar200._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar18._4_8_ = auVar200._8_8_;
  auVar18._2_2_ = uVar75;
  auVar18._0_2_ = uVar75;
  fVar51 = (float)((int)sVar82 >> 8);
  fVar76 = (float)(auVar18._0_4_ >> 0x18);
  fVar78 = (float)(auVar200._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0x13 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar42;
  auVar205._12_2_ = uVar75;
  auVar205._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar42;
  auVar204._10_2_ = uVar75;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar75;
  auVar203._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar19._4_8_ = auVar203._8_8_;
  auVar19._2_2_ = uVar75;
  auVar19._0_2_ = uVar75;
  fVar254 = (float)((int)sVar82 >> 8);
  fVar256 = (float)(auVar19._0_4_ >> 0x18);
  fVar258 = (float)(auVar203._8_4_ >> 0x18);
  fVar260 = (float)(auVar204._12_4_ >> 0x18);
  fVar288 = fVar153 * fVar180 + fVar156 * fVar233;
  fVar293 = fVar153 * fVar190 + fVar156 * fVar236;
  fVar298 = fVar153 * fVar191 + fVar156 * fVar237;
  fVar303 = fVar153 * (float)(auVar88._12_4_ >> 0x18) + fVar156 * (float)(auVar91._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar33 * 0x14 + 6);
  uVar121 = (undefined1)((uint)uVar6 >> 0x18);
  uVar75 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar6 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar75,uVar121),CONCAT14(uVar121,uVar6));
  uVar121 = (undefined1)((uint)uVar6 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar121),uVar121);
  sVar82 = CONCAT11((char)uVar6,(char)uVar6);
  uVar42 = CONCAT62(uVar11,sVar82);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar42;
  auVar265._12_2_ = uVar75;
  auVar265._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar42;
  auVar264._10_2_ = uVar75;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar75;
  auVar263._0_8_ = uVar42;
  uVar75 = (undefined2)uVar11;
  auVar20._4_8_ = auVar263._8_8_;
  auVar20._2_2_ = uVar75;
  auVar20._0_2_ = uVar75;
  fVar83 = (float)((int)sVar82 >> 8);
  fVar122 = (float)(auVar20._0_4_ >> 0x18);
  fVar123 = (float)(auVar263._8_4_ >> 0x18);
  fVar273 = fVar139 * fVar124 + fVar288;
  fVar281 = fVar139 * fVar134 + fVar293;
  fVar282 = fVar139 * fVar136 + fVar298;
  fVar283 = fVar139 * (float)(auVar85._12_4_ >> 0x18) + fVar303;
  fVar262 = fVar139 * fVar238 + fVar153 * fVar218 + fVar156 * fVar244;
  fVar270 = fVar139 * fVar241 + fVar153 * fVar224 + fVar156 * fVar249;
  fVar271 = fVar139 * fVar243 + fVar153 * fVar228 + fVar156 * fVar251;
  fVar272 = fVar139 * (float)(auVar94._12_4_ >> 0x18) +
            fVar153 * (float)(auVar195._12_4_ >> 0x18) + fVar156 * (float)(auVar198._12_4_ >> 0x18);
  fVar192 = fVar139 * fVar51 + fVar153 * fVar254 + fVar156 * fVar83;
  fVar213 = fVar139 * fVar76 + fVar153 * fVar256 + fVar156 * fVar122;
  fVar215 = fVar139 * fVar78 + fVar153 * fVar258 + fVar156 * fVar123;
  fVar139 = fVar139 * (float)(auVar201._12_4_ >> 0x18) +
            fVar153 * fVar260 + fVar156 * (float)(auVar264._12_4_ >> 0x18);
  fVar180 = fVar124 * fVar161 + fVar180 * fVar173 + fVar233 * fVar175;
  fVar190 = fVar134 * fVar161 + fVar190 * fVar173 + fVar236 * fVar175;
  fVar191 = fVar136 * fVar161 + fVar191 * fVar173 + fVar237 * fVar175;
  fVar233 = (float)(auVar85._12_4_ >> 0x18) * fVar161 +
            (float)(auVar88._12_4_ >> 0x18) * fVar173 + (float)(auVar91._12_4_ >> 0x18) * fVar175;
  fVar236 = fVar238 * fVar161 + fVar218 * fVar173 + fVar244 * fVar175;
  fVar237 = fVar241 * fVar161 + fVar224 * fVar173 + fVar249 * fVar175;
  fVar238 = fVar243 * fVar161 + fVar228 * fVar173 + fVar251 * fVar175;
  fVar241 = (float)(auVar94._12_4_ >> 0x18) * fVar161 +
            (float)(auVar195._12_4_ >> 0x18) * fVar173 + (float)(auVar198._12_4_ >> 0x18) * fVar175;
  fVar218 = fVar161 * fVar51 + fVar173 * fVar254 + fVar175 * fVar83;
  fVar224 = fVar161 * fVar76 + fVar173 * fVar256 + fVar175 * fVar122;
  fVar228 = fVar161 * fVar78 + fVar173 * fVar258 + fVar175 * fVar123;
  fVar161 = fVar161 * (float)(auVar201._12_4_ >> 0x18) +
            fVar173 * fVar260 + fVar175 * (float)(auVar264._12_4_ >> 0x18);
  fVar156 = (float)DAT_01f4bd50;
  fVar51 = DAT_01f4bd50._4_4_;
  fVar76 = DAT_01f4bd50._8_4_;
  fVar78 = DAT_01f4bd50._12_4_;
  uVar45 = -(uint)(fVar156 <= ABS(fVar273));
  uVar46 = -(uint)(fVar51 <= ABS(fVar281));
  uVar47 = -(uint)(fVar76 <= ABS(fVar282));
  uVar49 = -(uint)(fVar78 <= ABS(fVar283));
  auVar274._0_4_ = (uint)fVar273 & uVar45;
  auVar274._4_4_ = (uint)fVar281 & uVar46;
  auVar274._8_4_ = (uint)fVar282 & uVar47;
  auVar274._12_4_ = (uint)fVar283 & uVar49;
  auVar163._0_4_ = ~uVar45 & (uint)fVar156;
  auVar163._4_4_ = ~uVar46 & (uint)fVar51;
  auVar163._8_4_ = ~uVar47 & (uint)fVar76;
  auVar163._12_4_ = ~uVar49 & (uint)fVar78;
  auVar163 = auVar163 | auVar274;
  uVar45 = -(uint)(fVar156 <= ABS(fVar262));
  uVar46 = -(uint)(fVar51 <= ABS(fVar270));
  uVar47 = -(uint)(fVar76 <= ABS(fVar271));
  uVar49 = -(uint)(fVar78 <= ABS(fVar272));
  auVar266._0_4_ = (uint)fVar262 & uVar45;
  auVar266._4_4_ = (uint)fVar270 & uVar46;
  auVar266._8_4_ = (uint)fVar271 & uVar47;
  auVar266._12_4_ = (uint)fVar272 & uVar49;
  auVar181._0_4_ = ~uVar45 & (uint)fVar156;
  auVar181._4_4_ = ~uVar46 & (uint)fVar51;
  auVar181._8_4_ = ~uVar47 & (uint)fVar76;
  auVar181._12_4_ = ~uVar49 & (uint)fVar78;
  auVar181 = auVar181 | auVar266;
  uVar45 = -(uint)(fVar156 <= ABS(fVar192));
  uVar46 = -(uint)(fVar51 <= ABS(fVar213));
  uVar47 = -(uint)(fVar76 <= ABS(fVar215));
  uVar49 = -(uint)(fVar78 <= ABS(fVar139));
  auVar206._0_4_ = (uint)fVar192 & uVar45;
  auVar206._4_4_ = (uint)fVar213 & uVar46;
  auVar206._8_4_ = (uint)fVar215 & uVar47;
  auVar206._12_4_ = (uint)fVar139 & uVar49;
  auVar221._0_4_ = ~uVar45 & (uint)fVar156;
  auVar221._4_4_ = ~uVar46 & (uint)fVar51;
  auVar221._8_4_ = ~uVar47 & (uint)fVar76;
  auVar221._12_4_ = ~uVar49 & (uint)fVar78;
  auVar221 = auVar221 | auVar206;
  auVar53 = rcpps(_DAT_01f4bd50,auVar163);
  fVar156 = auVar53._0_4_;
  fVar78 = auVar53._4_4_;
  fVar123 = auVar53._8_4_;
  fVar136 = auVar53._12_4_;
  fVar156 = (1.0 - auVar163._0_4_ * fVar156) * fVar156 + fVar156;
  fVar78 = (1.0 - auVar163._4_4_ * fVar78) * fVar78 + fVar78;
  fVar123 = (1.0 - auVar163._8_4_ * fVar123) * fVar123 + fVar123;
  fVar136 = (1.0 - auVar163._12_4_ * fVar136) * fVar136 + fVar136;
  auVar53 = rcpps(auVar53,auVar181);
  fVar51 = auVar53._0_4_;
  fVar83 = auVar53._4_4_;
  fVar124 = auVar53._8_4_;
  fVar139 = auVar53._12_4_;
  fVar51 = (1.0 - auVar181._0_4_ * fVar51) * fVar51 + fVar51;
  fVar83 = (1.0 - auVar181._4_4_ * fVar83) * fVar83 + fVar83;
  fVar124 = (1.0 - auVar181._8_4_ * fVar124) * fVar124 + fVar124;
  fVar139 = (1.0 - auVar181._12_4_ * fVar139) * fVar139 + fVar139;
  auVar53 = rcpps(auVar53,auVar221);
  fVar76 = auVar53._0_4_;
  fVar122 = auVar53._4_4_;
  fVar134 = auVar53._8_4_;
  fVar153 = auVar53._12_4_;
  fVar76 = (1.0 - auVar221._0_4_ * fVar76) * fVar76 + fVar76;
  fVar122 = (1.0 - auVar221._4_4_ * fVar122) * fVar122 + fVar122;
  fVar134 = (1.0 - auVar221._8_4_ * fVar134) * fVar134 + fVar134;
  fVar153 = (1.0 - auVar221._12_4_ * fVar153) * fVar153 + fVar153;
  uVar42 = *(ulong *)(prim + uVar33 * 7 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar42;
  auVar54._12_2_ = uVar75;
  auVar54._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar183._12_4_ = auVar54._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar42;
  auVar183._10_2_ = uVar75;
  auVar53._10_6_ = auVar183._10_6_;
  auVar53._8_2_ = uVar75;
  auVar53._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar53._8_8_;
  auVar21._2_2_ = uVar75;
  auVar21._0_2_ = uVar75;
  auVar164._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar190) * fVar78,
                ((float)(int)(short)uVar42 - fVar180) * fVar156);
  auVar164._8_4_ = ((float)(auVar53._8_4_ >> 0x10) - fVar191) * fVar123;
  auVar164._12_4_ = ((float)(auVar183._12_4_ >> 0x10) - fVar233) * fVar136;
  uVar42 = *(ulong *)(prim + uVar33 * 9 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._12_2_ = uVar75;
  auVar57._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar42;
  auVar56._10_2_ = uVar75;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar75;
  auVar55._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar55._8_8_;
  auVar22._2_2_ = uVar75;
  auVar22._0_2_ = uVar75;
  auVar222._0_4_ = ((float)(int)(short)uVar42 - fVar180) * fVar156;
  auVar222._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar190) * fVar78;
  auVar222._8_4_ = ((float)(auVar55._8_4_ >> 0x10) - fVar191) * fVar123;
  auVar222._12_4_ = ((float)(auVar56._12_4_ >> 0x10) - fVar233) * fVar136;
  uVar42 = *(ulong *)(prim + uVar33 * 0xe + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar42;
  auVar60._12_2_ = uVar75;
  auVar60._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar42;
  auVar59._10_2_ = uVar75;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar75;
  auVar58._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar23._4_8_ = auVar58._8_8_;
  auVar23._2_2_ = uVar75;
  auVar23._0_2_ = uVar75;
  auVar126._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar237) * fVar83,
                ((float)(int)(short)uVar42 - fVar236) * fVar51);
  auVar126._8_4_ = ((float)(auVar58._8_4_ >> 0x10) - fVar238) * fVar124;
  auVar126._12_4_ = ((float)(auVar59._12_4_ >> 0x10) - fVar241) * fVar139;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar42;
  auVar63._12_2_ = uVar75;
  auVar63._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar42;
  auVar62._10_2_ = uVar75;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar75;
  auVar61._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar61._8_8_;
  auVar24._2_2_ = uVar75;
  auVar24._0_2_ = uVar75;
  auVar64._0_4_ = ((float)(int)(short)uVar42 - fVar236) * fVar51;
  auVar64._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar237) * fVar83;
  auVar64._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar238) * fVar124;
  auVar64._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar241) * fVar139;
  uVar42 = *(ulong *)(prim + uVar33 * 0x15 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar42;
  auVar98._12_2_ = uVar75;
  auVar98._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar42;
  auVar97._10_2_ = uVar75;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar75;
  auVar96._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar96._8_8_;
  auVar25._2_2_ = uVar75;
  auVar25._0_2_ = uVar75;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar224) * fVar122,
                ((float)(int)(short)uVar42 - fVar218) * fVar76);
  auVar99._8_4_ = ((float)(auVar96._8_4_ >> 0x10) - fVar228) * fVar134;
  auVar99._12_4_ = ((float)(auVar97._12_4_ >> 0x10) - fVar161) * fVar153;
  uVar42 = *(ulong *)(prim + uVar33 * 0x17 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar42;
  auVar209._12_2_ = uVar75;
  auVar209._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar42;
  auVar208._10_2_ = uVar75;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar75;
  auVar207._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar26._4_8_ = auVar207._8_8_;
  auVar26._2_2_ = uVar75;
  auVar26._0_2_ = uVar75;
  auVar210._0_4_ = ((float)(int)(short)uVar42 - fVar218) * fVar76;
  auVar210._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar224) * fVar122;
  auVar210._8_4_ = ((float)(auVar207._8_4_ >> 0x10) - fVar228) * fVar134;
  auVar210._12_4_ = ((float)(auVar208._12_4_ >> 0x10) - fVar161) * fVar153;
  auVar182._8_4_ = auVar164._8_4_;
  auVar182._0_8_ = auVar164._0_8_;
  auVar182._12_4_ = auVar164._12_4_;
  auVar183 = minps(auVar182,auVar222);
  auVar142._8_4_ = auVar126._8_4_;
  auVar142._0_8_ = auVar126._0_8_;
  auVar142._12_4_ = auVar126._12_4_;
  auVar53 = minps(auVar142,auVar64);
  auVar183 = maxps(auVar183,auVar53);
  auVar143._8_4_ = auVar99._8_4_;
  auVar143._0_8_ = auVar99._0_8_;
  auVar143._12_4_ = auVar99._12_4_;
  auVar53 = minps(auVar143,auVar210);
  auVar239._4_4_ = uVar41;
  auVar239._0_4_ = uVar41;
  auVar239._8_4_ = uVar41;
  auVar239._12_4_ = uVar41;
  auVar53 = maxps(auVar53,auVar239);
  auVar53 = maxps(auVar183,auVar53);
  local_48 = auVar53._0_4_ * 0.99999964;
  fStack_44 = auVar53._4_4_ * 0.99999964;
  fStack_40 = auVar53._8_4_ * 0.99999964;
  fStack_3c = auVar53._12_4_ * 0.99999964;
  auVar183 = maxps(auVar164,auVar222);
  auVar53 = maxps(auVar126,auVar64);
  auVar183 = minps(auVar183,auVar53);
  auVar53 = maxps(auVar99,auVar210);
  uVar41 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar65._4_4_ = uVar41;
  auVar65._0_4_ = uVar41;
  auVar65._8_4_ = uVar41;
  auVar65._12_4_ = uVar41;
  auVar53 = minps(auVar53,auVar65);
  auVar53 = minps(auVar183,auVar53);
  auVar100._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_48 <= auVar53._0_4_ * 1.0000004);
  auVar100._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_44 <= auVar53._4_4_ * 1.0000004);
  auVar100._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_40 <= auVar53._8_4_ * 1.0000004);
  auVar100._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_3c <= auVar53._12_4_ * 1.0000004);
  uVar41 = movmskps((int)unaff_RBP,auVar100);
  uVar42 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar41);
  pLVar43 = pre->ray_space + k;
  local_3c8 = mm_lookupmask_ps._0_8_;
  uStack_3c0 = mm_lookupmask_ps._8_8_;
  lVar38 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_3e0 = pLVar43;
  local_3d8 = prim;
  do {
    if (uVar42 == 0) {
      return;
    }
    lVar34 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
      }
    }
    uVar45 = *(uint *)(prim + 2);
    local_3d0 = (RTCIntersectArguments *)(ulong)uVar45;
    uVar46 = *(uint *)(prim + lVar34 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[(long)local_3d0].ptr;
    lVar34 = *(long *)&pGVar8[1].time_range.upper;
    uVar33 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar46 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    pfVar1 = (float *)(lVar34 + (long)pGVar8[1].intersectionFilterN * uVar33);
    fVar78 = *pfVar1;
    fVar83 = pfVar1[1];
    uVar9 = *(undefined8 *)pfVar1;
    bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
    pfVar10 = pfVar1 + 2;
    fVar122 = *pfVar10;
    fVar123 = pfVar1[3];
    uVar31 = *(undefined8 *)pfVar10;
    bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ = *(undefined8 *)pfVar10;
    pfVar1 = (float *)(lVar34 + (long)pGVar8[1].intersectionFilterN * (uVar33 + 1));
    local_398 = *pfVar1;
    fStack_394 = pfVar1[1];
    bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_390 = pfVar1[2];
    fStack_38c = pfVar1[3];
    bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    pRVar39 = (RTCIntersectArguments *)pGVar8[2].intersectionFilterN;
    lVar34 = uVar33 * (long)pGVar8[2].pointQueryFunc;
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar156 = *(float *)(ray + k * 4);
    fVar51 = *(float *)(ray + k * 4 + 0x10);
    fVar76 = *(float *)(ray + k * 4 + 0x20);
    ppSVar2 = (Scene **)((long)&pRVar39->flags + lVar34);
    local_3a8 = *(float *)ppSVar2 * 0.33333334 + fVar78;
    fStack_3a4 = *(float *)((long)ppSVar2 + 4) * 0.33333334 + fVar83;
    fStack_3a0 = *(float *)(ppSVar2 + 1) * 0.33333334 + fVar122;
    fVar237 = *(float *)((long)ppSVar2 + 0xc) * 0.33333334 + fVar123;
    ppSVar2 = (Scene **)((long)&pRVar39->flags + (long)pGVar8[2].pointQueryFunc * (uVar33 + 1));
    local_3b8 = local_398 - *(float *)ppSVar2 * 0.33333334;
    fStack_3b4 = fStack_394 - *(float *)((long)ppSVar2 + 4) * 0.33333334;
    fStack_3b0 = fStack_390 - *(float *)(ppSVar2 + 1) * 0.33333334;
    fVar238 = fStack_38c - *(float *)((long)ppSVar2 + 0xc) * 0.33333334;
    fVar218 = fVar78 - fVar156;
    fVar224 = fVar83 - fVar51;
    fVar228 = fVar122 - fVar76;
    fVar124 = (pLVar43->vx).field_0.m128[0];
    fVar134 = (pLVar43->vx).field_0.m128[1];
    fVar136 = (pLVar43->vx).field_0.m128[2];
    fVar139 = (pLVar43->vy).field_0.m128[0];
    fVar153 = (pLVar43->vy).field_0.m128[1];
    fVar180 = (pLVar43->vy).field_0.m128[2];
    fVar190 = (pLVar43->vz).field_0.m128[0];
    fVar191 = (pLVar43->vz).field_0.m128[1];
    fVar233 = (pLVar43->vz).field_0.m128[2];
    fVar161 = fVar218 * fVar124 + fVar224 * fVar139 + fVar228 * fVar190;
    fVar175 = fVar218 * fVar134 + fVar224 * fVar153 + fVar228 * fVar191;
    fVar213 = fVar218 * fVar136 + fVar224 * fVar180 + fVar228 * fVar233;
    fVar218 = local_3a8 - fVar156;
    fVar224 = fStack_3a4 - fVar51;
    fVar228 = fStack_3a0 - fVar76;
    fVar173 = fVar218 * fVar124 + fVar224 * fVar139 + fVar228 * fVar190;
    fVar192 = fVar218 * fVar134 + fVar224 * fVar153 + fVar228 * fVar191;
    local_378 = fVar218 * fVar136 + fVar224 * fVar180 + fVar228 * fVar233;
    fVar218 = local_3b8 - fVar156;
    fVar224 = fStack_3b4 - fVar51;
    fVar228 = fStack_3b0 - fVar76;
    fVar215 = fVar218 * fVar124 + fVar224 * fVar139 + fVar228 * fVar190;
    fVar236 = fVar218 * fVar134 + fVar224 * fVar153 + fVar228 * fVar191;
    fVar218 = fVar218 * fVar136 + fVar224 * fVar180 + fVar228 * fVar233;
    fVar156 = local_398 - fVar156;
    fVar51 = fStack_394 - fVar51;
    fVar76 = fStack_390 - fVar76;
    fVar124 = fVar156 * fVar124 + fVar51 * fVar139 + fVar76 * fVar190;
    fVar134 = fVar156 * fVar134 + fVar51 * fVar153 + fVar76 * fVar191;
    fVar51 = fVar156 * fVar136 + fVar51 * fVar180 + fVar76 * fVar233;
    auVar246._0_8_ = CONCAT44(fVar175,fVar161) & 0x7fffffff7fffffff;
    auVar246._8_4_ = ABS(fVar213);
    auVar246._12_4_ = ABS(fVar123);
    auVar165._0_8_ = CONCAT44(fVar192,fVar173) & 0x7fffffff7fffffff;
    auVar165._8_4_ = ABS(local_378);
    auVar165._12_4_ = ABS(fVar237);
    auVar183 = maxps(auVar246,auVar165);
    auVar184._0_8_ = CONCAT44(fVar236,fVar215) & 0x7fffffff7fffffff;
    auVar184._8_4_ = ABS(fVar218);
    auVar184._12_4_ = ABS(fVar238);
    auVar101._0_8_ = CONCAT44(fVar134,fVar124) & 0x7fffffff7fffffff;
    auVar101._8_4_ = ABS(fVar51);
    auVar101._12_4_ = ABS(fStack_38c);
    auVar53 = maxps(auVar184,auVar101);
    auVar53 = maxps(auVar183,auVar53);
    uVar80 = auVar53._8_8_;
    fVar156 = auVar53._4_4_;
    if (auVar53._4_4_ <= auVar53._0_4_) {
      fVar156 = auVar53._0_4_;
    }
    auVar247._8_8_ = uVar80;
    auVar247._0_8_ = uVar80;
    fVar76 = (float)iVar7;
    if (auVar53._8_4_ <= fVar156) {
      auVar248._4_12_ = auVar247._4_12_;
      auVar248._0_4_ = fVar156;
      uVar80 = auVar248._0_8_;
    }
    lVar40 = (long)iVar7 * 0x44;
    fVar156 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar40 + 0x908);
    fVar136 = *(float *)(bezier_basis0 + lVar40 + 0x90c);
    fVar139 = *(float *)(bezier_basis0 + lVar40 + 0x910);
    auVar12 = *(undefined1 (*) [12])(bezier_basis0 + lVar40 + 0x908);
    fVar153 = *(float *)(bezier_basis0 + lVar40 + 0x914);
    fVar180 = *(float *)(bezier_basis0 + lVar40 + 0xd8c);
    fVar190 = *(float *)(bezier_basis0 + lVar40 + 0xd90);
    fVar191 = *(float *)(bezier_basis0 + lVar40 + 0xd94);
    fVar233 = *(float *)(bezier_basis0 + lVar40 + 0xd98);
    fVar224 = *(float *)(bezier_basis0 + lVar40 + 0x484);
    fVar228 = *(float *)(bezier_basis0 + lVar40 + 0x488);
    fVar241 = *(float *)(bezier_basis0 + lVar40 + 0x48c);
    fVar243 = *(float *)(bezier_basis0 + lVar40 + 0x490);
    fVar244 = *(float *)(bezier_basis0 + lVar40);
    fVar249 = *(float *)(bezier_basis0 + lVar40 + 4);
    fVar251 = *(float *)(bezier_basis0 + lVar40 + 8);
    fVar262 = *(float *)(bezier_basis0 + lVar40 + 0xc);
    fVar140 = fVar161 * fVar244 + fVar173 * fVar224 + fVar215 * fVar156 + fVar124 * fVar180;
    fVar154 = fVar161 * fVar249 + fVar173 * fVar228 + fVar215 * fVar136 + fVar124 * fVar190;
    fVar157 = fVar161 * fVar251 + fVar173 * fVar241 + fVar215 * fVar139 + fVar124 * fVar191;
    fVar159 = fVar161 * fVar262 + fVar173 * fVar243 + fVar215 * fVar153 + fVar124 * fVar233;
    fVar289 = fVar175 * fVar244 + fVar192 * fVar224 + fVar236 * fVar156 + fVar134 * fVar180;
    fVar294 = fVar175 * fVar249 + fVar192 * fVar228 + fVar236 * fVar136 + fVar134 * fVar190;
    fVar299 = fVar175 * fVar251 + fVar192 * fVar241 + fVar236 * fVar139 + fVar134 * fVar191;
    fVar304 = fVar175 * fVar262 + fVar192 * fVar243 + fVar236 * fVar153 + fVar134 * fVar233;
    auVar267._0_4_ =
         fVar123 * fVar244 + fVar237 * fVar224 + fVar238 * fVar156 + fStack_38c * fVar180;
    auVar267._4_4_ =
         fVar123 * fVar249 + fVar237 * fVar228 + fVar238 * fVar136 + fStack_38c * fVar190;
    auVar267._8_4_ =
         fVar123 * fVar251 + fVar237 * fVar241 + fVar238 * fVar139 + fStack_38c * fVar191;
    auVar267._12_4_ =
         fVar123 * fVar262 + fVar237 * fVar243 + fVar238 * fVar153 + fStack_38c * fVar233;
    fVar156 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar40 + 0xd8c);
    fVar136 = *(float *)(bezier_basis1 + lVar40 + 0xd90);
    fVar139 = *(float *)(bezier_basis1 + lVar40 + 0xd94);
    auVar13 = *(undefined1 (*) [12])(bezier_basis1 + lVar40 + 0xd8c);
    fVar270 = *(float *)(bezier_basis1 + lVar40 + 0xd98);
    fVar271 = *(float *)(bezier_basis1 + lVar40 + 0x908);
    fVar272 = *(float *)(bezier_basis1 + lVar40 + 0x90c);
    fVar273 = *(float *)(bezier_basis1 + lVar40 + 0x910);
    fVar281 = *(float *)(bezier_basis1 + lVar40 + 0x914);
    local_58 = fStack_38c;
    fStack_54 = fStack_38c;
    fStack_50 = fStack_38c;
    fStack_4c = fStack_38c;
    fVar282 = *(float *)(bezier_basis1 + lVar40 + 0x484);
    fVar283 = *(float *)(bezier_basis1 + lVar40 + 0x488);
    fVar291 = *(float *)(bezier_basis1 + lVar40 + 0x48c);
    fVar297 = *(float *)(bezier_basis1 + lVar40 + 0x490);
    fVar302 = *(float *)(bezier_basis1 + lVar40);
    fVar307 = *(float *)(bezier_basis1 + lVar40 + 4);
    fVar227 = *(float *)(bezier_basis1 + lVar40 + 8);
    fVar242 = *(float *)(bezier_basis1 + lVar40 + 0xc);
    fVar219 = fVar161 * fVar302 + fVar173 * fVar282 + fVar215 * fVar271 + fVar124 * fVar156;
    fVar225 = fVar161 * fVar307 + fVar173 * fVar283 + fVar215 * fVar272 + fVar124 * fVar136;
    fVar229 = fVar161 * fVar227 + fVar173 * fVar291 + fVar215 * fVar273 + fVar124 * fVar139;
    fVar231 = fVar161 * fVar242 + fVar173 * fVar297 + fVar215 * fVar281 + fVar124 * fVar270;
    fVar52 = fVar175 * fVar302 + fVar192 * fVar282 + fVar236 * fVar271 + fVar134 * fVar156;
    fVar77 = fVar175 * fVar307 + fVar192 * fVar283 + fVar236 * fVar272 + fVar134 * fVar136;
    fVar79 = fVar175 * fVar227 + fVar192 * fVar291 + fVar236 * fVar273 + fVar134 * fVar139;
    fVar81 = fVar175 * fVar242 + fVar192 * fVar297 + fVar236 * fVar281 + fVar134 * fVar270;
    auVar185._0_4_ =
         fVar123 * fVar302 + fVar237 * fVar282 + fVar238 * fVar271 + fStack_38c * fVar156;
    auVar185._4_4_ =
         fVar123 * fVar307 + fVar237 * fVar283 + fVar238 * fVar272 + fStack_38c * fVar136;
    auVar185._8_4_ =
         fVar123 * fVar227 + fVar237 * fVar291 + fVar238 * fVar273 + fStack_38c * fVar139;
    auVar185._12_4_ =
         fVar123 * fVar242 + fVar237 * fVar297 + fVar238 * fVar281 + fStack_38c * fVar270;
    fVar193 = fVar219 - fVar140;
    fVar214 = fVar225 - fVar154;
    fVar216 = fVar229 - fVar157;
    fVar217 = fVar231 - fVar159;
    fVar136 = fVar52 - fVar289;
    fVar139 = fVar77 - fVar294;
    fVar176 = fVar79 - fVar299;
    fVar178 = fVar81 - fVar304;
    fVar156 = fVar289 * fVar193 - fVar140 * fVar136;
    fVar295 = fVar294 * fVar214 - fVar154 * fVar139;
    fVar300 = fVar299 * fVar216 - fVar157 * fVar176;
    fVar305 = fVar304 * fVar217 - fVar159 * fVar178;
    auVar53 = maxps(auVar267,auVar185);
    bVar29 = fVar156 * fVar156 <=
             auVar53._0_4_ * auVar53._0_4_ * (fVar193 * fVar193 + fVar136 * fVar136) && 0.0 < fVar76
    ;
    auVar292._0_4_ = -(uint)bVar29;
    bVar30 = fVar295 * fVar295 <=
             auVar53._4_4_ * auVar53._4_4_ * (fVar214 * fVar214 + fVar139 * fVar139) && 1.0 < fVar76
    ;
    auVar292._4_4_ = -(uint)bVar30;
    bVar28 = fVar300 * fVar300 <=
             auVar53._8_4_ * auVar53._8_4_ * (fVar216 * fVar216 + fVar176 * fVar176) && 2.0 < fVar76
    ;
    auVar292._8_4_ = -(uint)bVar28;
    bVar27 = 3.0 < fVar76 &&
             fVar305 * fVar305 <=
             auVar53._12_4_ * auVar53._12_4_ * (fVar217 * fVar217 + fVar178 * fVar178);
    auVar292._12_4_ = -(uint)bVar27;
    local_458 = (float)uVar80;
    local_458 = local_458 * 4.7683716e-07;
    iVar32 = movmskps((int)lVar34,auVar292);
    fVar156 = *(float *)(ray + k * 4 + 0x30);
    _local_388 = ZEXT416((uint)fVar156);
    fStack_3ac = fVar238;
    fStack_39c = fVar237;
    fStack_374 = local_378;
    fStack_370 = local_378;
    fStack_36c = local_378;
    if (iVar32 != 0) {
      local_518._0_4_ = auVar13._0_4_;
      local_518._4_4_ = auVar13._4_4_;
      fStack_510 = auVar13._8_4_;
      fVar141 = (float)local_518._0_4_ * fVar51 + fVar271 * fVar218 + fVar282 * local_378 +
                fVar302 * fVar213;
      fVar155 = (float)local_518._4_4_ * fVar51 + fVar272 * fVar218 + fVar283 * local_378 +
                fVar307 * fVar213;
      fVar158 = fStack_510 * fVar51 + fVar273 * fVar218 + fVar291 * local_378 + fVar227 * fVar213;
      fVar160 = fVar270 * fVar51 + fVar281 * fVar218 + fVar297 * local_378 + fVar242 * fVar213;
      local_428 = auVar12._0_4_;
      fStack_424 = auVar12._4_4_;
      fStack_420 = auVar12._8_4_;
      fVar125 = fVar180 * fVar51 + local_428 * fVar218 + fVar224 * local_378 + fVar244 * fVar213;
      fVar135 = fVar190 * fVar51 + fStack_424 * fVar218 + fVar228 * local_378 + fVar249 * fVar213;
      fVar137 = fVar191 * fVar51 + fStack_420 * fVar218 + fVar241 * local_378 + fVar251 * fVar213;
      fVar138 = fVar233 * fVar51 + fVar153 * fVar218 + fVar243 * local_378 + fVar262 * fVar213;
      fVar153 = *(float *)(bezier_basis0 + lVar40 + 0x1210);
      fVar180 = *(float *)(bezier_basis0 + lVar40 + 0x1214);
      fVar190 = *(float *)(bezier_basis0 + lVar40 + 0x1218);
      fVar191 = *(float *)(bezier_basis0 + lVar40 + 0x121c);
      fVar233 = *(float *)(bezier_basis0 + lVar40 + 0x1694);
      fVar224 = *(float *)(bezier_basis0 + lVar40 + 0x1698);
      fVar228 = *(float *)(bezier_basis0 + lVar40 + 0x169c);
      fVar241 = *(float *)(bezier_basis0 + lVar40 + 0x16a0);
      fVar243 = *(float *)(bezier_basis0 + lVar40 + 0x1b18);
      fVar244 = *(float *)(bezier_basis0 + lVar40 + 0x1b1c);
      fVar249 = *(float *)(bezier_basis0 + lVar40 + 0x1b20);
      fVar251 = *(float *)(bezier_basis0 + lVar40 + 0x1b24);
      fVar262 = *(float *)(bezier_basis0 + lVar40 + 0x1f9c);
      fVar270 = *(float *)(bezier_basis0 + lVar40 + 0x1fa0);
      fVar271 = *(float *)(bezier_basis0 + lVar40 + 0x1fa4);
      fVar272 = *(float *)(bezier_basis0 + lVar40 + 0x1fa8);
      fVar245 = fVar161 * fVar153 + fVar173 * fVar233 + fVar215 * fVar243 + fVar124 * fVar262;
      fVar250 = fVar161 * fVar180 + fVar173 * fVar224 + fVar215 * fVar244 + fVar124 * fVar270;
      fVar252 = fVar161 * fVar190 + fVar173 * fVar228 + fVar215 * fVar249 + fVar124 * fVar271;
      fVar253 = fVar161 * fVar191 + fVar173 * fVar241 + fVar215 * fVar251 + fVar124 * fVar272;
      fVar290 = fVar175 * fVar153 + fVar192 * fVar233 + fVar236 * fVar243 + fVar134 * fVar262;
      fVar296 = fVar175 * fVar180 + fVar192 * fVar224 + fVar236 * fVar244 + fVar134 * fVar270;
      fVar301 = fVar175 * fVar190 + fVar192 * fVar228 + fVar236 * fVar249 + fVar134 * fVar271;
      fVar306 = fVar175 * fVar191 + fVar192 * fVar241 + fVar236 * fVar251 + fVar134 * fVar272;
      fVar273 = *(float *)(bezier_basis1 + lVar40 + 0x1210);
      fVar281 = *(float *)(bezier_basis1 + lVar40 + 0x1214);
      fVar282 = *(float *)(bezier_basis1 + lVar40 + 0x1218);
      fVar283 = *(float *)(bezier_basis1 + lVar40 + 0x121c);
      fVar291 = *(float *)(bezier_basis1 + lVar40 + 0x1b18);
      fVar297 = *(float *)(bezier_basis1 + lVar40 + 0x1b1c);
      fVar302 = *(float *)(bezier_basis1 + lVar40 + 0x1b20);
      fVar307 = *(float *)(bezier_basis1 + lVar40 + 0x1b24);
      fVar227 = *(float *)(bezier_basis1 + lVar40 + 0x1f9c);
      fVar242 = *(float *)(bezier_basis1 + lVar40 + 0x1fa0);
      fVar295 = *(float *)(bezier_basis1 + lVar40 + 0x1fa4);
      fVar300 = *(float *)(bezier_basis1 + lVar40 + 0x1fa8);
      fVar305 = *(float *)(bezier_basis1 + lVar40 + 0x1694);
      fVar257 = *(float *)(bezier_basis1 + lVar40 + 0x1698);
      fVar259 = *(float *)(bezier_basis1 + lVar40 + 0x169c);
      fVar261 = *(float *)(bezier_basis1 + lVar40 + 0x16a0);
      fVar220 = fVar161 * fVar273 + fVar173 * fVar305 + fVar215 * fVar291 + fVar124 * fVar227;
      fVar226 = fVar161 * fVar281 + fVar173 * fVar257 + fVar215 * fVar297 + fVar124 * fVar242;
      fVar230 = fVar161 * fVar282 + fVar173 * fVar259 + fVar215 * fVar302 + fVar124 * fVar295;
      fVar232 = fVar161 * fVar283 + fVar173 * fVar261 + fVar215 * fVar307 + fVar124 * fVar300;
      fVar162 = fVar175 * fVar273 + fVar192 * fVar305 + fVar236 * fVar291 + fVar134 * fVar227;
      fVar174 = fVar175 * fVar281 + fVar192 * fVar257 + fVar236 * fVar297 + fVar134 * fVar242;
      fVar177 = fVar175 * fVar282 + fVar192 * fVar259 + fVar236 * fVar302 + fVar134 * fVar295;
      fVar179 = fVar175 * fVar283 + fVar192 * fVar261 + fVar236 * fVar307 + fVar134 * fVar300;
      auVar268._0_8_ = CONCAT44(fVar250,fVar245) & 0x7fffffff7fffffff;
      auVar268._8_4_ = ABS(fVar252);
      auVar268._12_4_ = ABS(fVar253);
      auVar234._0_8_ = CONCAT44(fVar296,fVar290) & 0x7fffffff7fffffff;
      auVar234._8_4_ = ABS(fVar301);
      auVar234._12_4_ = ABS(fVar306);
      auVar53 = maxps(auVar268,auVar234);
      auVar275._0_8_ =
           CONCAT44(fVar180 * fVar213 + fVar224 * local_378 + fVar244 * fVar218 + fVar270 * fVar51,
                    fVar153 * fVar213 + fVar233 * local_378 + fVar243 * fVar218 + fVar262 * fVar51)
           & 0x7fffffff7fffffff;
      auVar275._8_4_ =
           ABS(fVar190 * fVar213 + fVar228 * local_378 + fVar249 * fVar218 + fVar271 * fVar51);
      auVar275._12_4_ =
           ABS(fVar191 * fVar213 + fVar241 * local_378 + fVar251 * fVar218 + fVar272 * fVar51);
      auVar53 = maxps(auVar53,auVar275);
      uVar47 = -(uint)(local_458 <= auVar53._0_4_);
      uVar49 = -(uint)(local_458 <= auVar53._4_4_);
      uVar48 = -(uint)(local_458 <= auVar53._8_4_);
      uVar50 = -(uint)(local_458 <= auVar53._12_4_);
      fVar191 = (float)((uint)fVar245 & uVar47 | ~uVar47 & (uint)fVar193);
      fVar224 = (float)((uint)fVar250 & uVar49 | ~uVar49 & (uint)fVar214);
      fVar249 = (float)((uint)fVar252 & uVar48 | ~uVar48 & (uint)fVar216);
      fVar251 = (float)((uint)fVar253 & uVar50 | ~uVar50 & (uint)fVar217);
      fVar262 = (float)(~uVar47 & (uint)fVar136 | (uint)fVar290 & uVar47);
      fVar270 = (float)(~uVar49 & (uint)fVar139 | (uint)fVar296 & uVar49);
      fVar271 = (float)(~uVar48 & (uint)fVar176 | (uint)fVar301 & uVar48);
      fVar272 = (float)(~uVar50 & (uint)fVar178 | (uint)fVar306 & uVar50);
      auVar276._0_8_ = CONCAT44(fVar226,fVar220) & 0x7fffffff7fffffff;
      auVar276._8_4_ = ABS(fVar230);
      auVar276._12_4_ = ABS(fVar232);
      auVar240._0_8_ = CONCAT44(fVar174,fVar162) & 0x7fffffff7fffffff;
      auVar240._8_4_ = ABS(fVar177);
      auVar240._12_4_ = ABS(fVar179);
      auVar53 = maxps(auVar276,auVar240);
      auVar211._0_8_ =
           CONCAT44(fVar281 * fVar213 + fVar257 * local_378 + fVar297 * fVar218 + fVar242 * fVar51,
                    fVar273 * fVar213 + fVar305 * local_378 + fVar291 * fVar218 + fVar227 * fVar51)
           & 0x7fffffff7fffffff;
      auVar211._8_4_ =
           ABS(fVar282 * fVar213 + fVar259 * local_378 + fVar302 * fVar218 + fVar295 * fVar51);
      auVar211._12_4_ =
           ABS(fVar283 * fVar213 + fVar261 * local_378 + fVar307 * fVar218 + fVar300 * fVar51);
      auVar53 = maxps(auVar53,auVar211);
      uVar47 = -(uint)(local_458 <= auVar53._0_4_);
      uVar49 = -(uint)(local_458 <= auVar53._4_4_);
      uVar48 = -(uint)(local_458 <= auVar53._8_4_);
      uVar50 = -(uint)(local_458 <= auVar53._12_4_);
      fVar190 = (float)((uint)fVar220 & uVar47 | ~uVar47 & (uint)fVar193);
      fVar233 = (float)((uint)fVar226 & uVar49 | ~uVar49 & (uint)fVar214);
      fVar228 = (float)((uint)fVar230 & uVar48 | ~uVar48 & (uint)fVar216);
      fVar241 = (float)((uint)fVar232 & uVar50 | ~uVar50 & (uint)fVar217);
      auVar166._0_4_ = (uint)fVar162 & uVar47;
      auVar166._4_4_ = (uint)fVar174 & uVar49;
      auVar166._8_4_ = (uint)fVar177 & uVar48;
      auVar166._12_4_ = (uint)fVar179 & uVar50;
      auVar277._0_4_ = ~uVar47 & (uint)fVar136;
      auVar277._4_4_ = ~uVar49 & (uint)fVar139;
      auVar277._8_4_ = ~uVar48 & (uint)fVar176;
      auVar277._12_4_ = ~uVar50 & (uint)fVar178;
      auVar277 = auVar277 | auVar166;
      auVar102._0_4_ = fVar262 * fVar262 + fVar191 * fVar191;
      auVar102._4_4_ = fVar270 * fVar270 + fVar224 * fVar224;
      auVar102._8_4_ = fVar271 * fVar271 + fVar249 * fVar249;
      auVar102._12_4_ = fVar272 * fVar272 + fVar251 * fVar251;
      auVar53 = rsqrtps(auVar166,auVar102);
      fVar136 = auVar53._0_4_;
      fVar139 = auVar53._4_4_;
      fVar153 = auVar53._8_4_;
      fVar180 = auVar53._12_4_;
      auVar167._0_4_ = fVar136 * fVar136 * auVar102._0_4_ * 0.5 * fVar136;
      auVar167._4_4_ = fVar139 * fVar139 * auVar102._4_4_ * 0.5 * fVar139;
      auVar167._8_4_ = fVar153 * fVar153 * auVar102._8_4_ * 0.5 * fVar153;
      auVar167._12_4_ = fVar180 * fVar180 * auVar102._12_4_ * 0.5 * fVar180;
      fVar291 = fVar136 * 1.5 - auVar167._0_4_;
      fVar297 = fVar139 * 1.5 - auVar167._4_4_;
      fVar302 = fVar153 * 1.5 - auVar167._8_4_;
      fVar307 = fVar180 * 1.5 - auVar167._12_4_;
      fVar273 = auVar277._0_4_;
      fVar281 = auVar277._4_4_;
      fVar282 = auVar277._8_4_;
      fVar283 = auVar277._12_4_;
      auVar103._0_4_ = fVar273 * fVar273 + fVar190 * fVar190;
      auVar103._4_4_ = fVar281 * fVar281 + fVar233 * fVar233;
      auVar103._8_4_ = fVar282 * fVar282 + fVar228 * fVar228;
      auVar103._12_4_ = fVar283 * fVar283 + fVar241 * fVar241;
      auVar53 = rsqrtps(auVar167,auVar103);
      fVar136 = auVar53._0_4_;
      fVar139 = auVar53._4_4_;
      fVar153 = auVar53._8_4_;
      fVar180 = auVar53._12_4_;
      fVar136 = fVar136 * 1.5 - fVar136 * fVar136 * auVar103._0_4_ * 0.5 * fVar136;
      fVar243 = fVar139 * 1.5 - fVar139 * fVar139 * auVar103._4_4_ * 0.5 * fVar139;
      fVar153 = fVar153 * 1.5 - fVar153 * fVar153 * auVar103._8_4_ * 0.5 * fVar153;
      fVar244 = fVar180 * 1.5 - fVar180 * fVar180 * auVar103._12_4_ * 0.5 * fVar180;
      fVar162 = fVar262 * fVar291 * auVar267._0_4_;
      fVar174 = fVar270 * fVar297 * auVar267._4_4_;
      fVar177 = fVar271 * fVar302 * auVar267._8_4_;
      fVar179 = fVar272 * fVar307 * auVar267._12_4_;
      fVar139 = -fVar191 * fVar291 * auVar267._0_4_;
      fVar180 = -fVar224 * fVar297 * auVar267._4_4_;
      fVar191 = -fVar249 * fVar302 * auVar267._8_4_;
      fVar224 = -fVar251 * fVar307 * auVar267._12_4_;
      fVar245 = fVar291 * 0.0 * auVar267._0_4_;
      fVar250 = fVar297 * 0.0 * auVar267._4_4_;
      fVar252 = fVar302 * 0.0 * auVar267._8_4_;
      fVar253 = fVar307 * 0.0 * auVar267._12_4_;
      fVar220 = fVar273 * fVar136 * auVar185._0_4_;
      fVar226 = fVar281 * fVar243 * auVar185._4_4_;
      fVar230 = fVar282 * fVar153 * auVar185._8_4_;
      fVar232 = fVar283 * fVar244 * auVar185._12_4_;
      fVar282 = fVar219 + fVar220;
      fVar283 = fVar225 + fVar226;
      fVar291 = fVar229 + fVar230;
      fVar297 = fVar231 + fVar232;
      fVar307 = -fVar190 * fVar136 * auVar185._0_4_;
      fVar242 = -fVar233 * fVar243 * auVar185._4_4_;
      fVar193 = -fVar228 * fVar153 * auVar185._8_4_;
      fVar214 = -fVar241 * fVar244 * auVar185._12_4_;
      fVar305 = fVar52 + fVar307;
      fVar257 = fVar77 + fVar242;
      fVar259 = fVar79 + fVar193;
      fVar261 = fVar81 + fVar214;
      fVar249 = fVar136 * 0.0 * auVar185._0_4_;
      fVar251 = fVar243 * 0.0 * auVar185._4_4_;
      fVar262 = fVar153 * 0.0 * auVar185._8_4_;
      fVar270 = fVar244 * 0.0 * auVar185._12_4_;
      fVar302 = fVar140 - fVar162;
      fVar227 = fVar154 - fVar174;
      fVar176 = fVar157 - fVar177;
      fVar178 = fVar159 - fVar179;
      fVar216 = fVar141 + fVar249;
      fVar217 = fVar155 + fVar251;
      fVar295 = fVar158 + fVar262;
      fVar300 = fVar160 + fVar270;
      fVar136 = fVar289 - fVar139;
      fVar153 = fVar294 - fVar180;
      fVar190 = fVar299 - fVar191;
      fVar233 = fVar304 - fVar224;
      fVar271 = fVar125 - fVar245;
      fVar272 = fVar135 - fVar250;
      fVar273 = fVar137 - fVar252;
      fVar281 = fVar138 - fVar253;
      uVar47 = -(uint)(0.0 < (fVar136 * (fVar216 - fVar271) - fVar271 * (fVar305 - fVar136)) * 0.0 +
                             (fVar271 * (fVar282 - fVar302) - (fVar216 - fVar271) * fVar302) * 0.0 +
                             ((fVar305 - fVar136) * fVar302 - (fVar282 - fVar302) * fVar136));
      uVar49 = -(uint)(0.0 < (fVar153 * (fVar217 - fVar272) - fVar272 * (fVar257 - fVar153)) * 0.0 +
                             (fVar272 * (fVar283 - fVar227) - (fVar217 - fVar272) * fVar227) * 0.0 +
                             ((fVar257 - fVar153) * fVar227 - (fVar283 - fVar227) * fVar153));
      uVar48 = -(uint)(0.0 < (fVar190 * (fVar295 - fVar273) - fVar273 * (fVar259 - fVar190)) * 0.0 +
                             (fVar273 * (fVar291 - fVar176) - (fVar295 - fVar273) * fVar176) * 0.0 +
                             ((fVar259 - fVar190) * fVar176 - (fVar291 - fVar176) * fVar190));
      uVar50 = -(uint)(0.0 < (fVar233 * (fVar300 - fVar281) - fVar281 * (fVar261 - fVar233)) * 0.0 +
                             (fVar281 * (fVar297 - fVar178) - (fVar300 - fVar281) * fVar178) * 0.0 +
                             ((fVar261 - fVar233) * fVar178 - (fVar297 - fVar178) * fVar233));
      fVar162 = (float)((uint)(fVar219 - fVar220) & uVar47 | ~uVar47 & (uint)(fVar140 + fVar162));
      fVar174 = (float)((uint)(fVar225 - fVar226) & uVar49 | ~uVar49 & (uint)(fVar154 + fVar174));
      fVar229 = (float)((uint)(fVar229 - fVar230) & uVar48 | ~uVar48 & (uint)(fVar157 + fVar177));
      fVar231 = (float)((uint)(fVar231 - fVar232) & uVar50 | ~uVar50 & (uint)(fVar159 + fVar179));
      fVar228 = (float)((uint)(fVar52 - fVar307) & uVar47 | ~uVar47 & (uint)(fVar289 + fVar139));
      fVar241 = (float)((uint)(fVar77 - fVar242) & uVar49 | ~uVar49 & (uint)(fVar294 + fVar180));
      fVar243 = (float)((uint)(fVar79 - fVar193) & uVar48 | ~uVar48 & (uint)(fVar299 + fVar191));
      fVar244 = (float)((uint)(fVar81 - fVar214) & uVar50 | ~uVar50 & (uint)(fVar304 + fVar224));
      fVar249 = (float)((uint)(fVar141 - fVar249) & uVar47 | ~uVar47 & (uint)(fVar125 + fVar245));
      fVar251 = (float)((uint)(fVar155 - fVar251) & uVar49 | ~uVar49 & (uint)(fVar135 + fVar250));
      fVar262 = (float)((uint)(fVar158 - fVar262) & uVar48 | ~uVar48 & (uint)(fVar137 + fVar252));
      fVar270 = (float)((uint)(fVar160 - fVar270) & uVar50 | ~uVar50 & (uint)(fVar138 + fVar253));
      fVar307 = (float)((uint)fVar302 & uVar47 | ~uVar47 & (uint)fVar282);
      fVar242 = (float)((uint)fVar227 & uVar49 | ~uVar49 & (uint)fVar283);
      fVar52 = (float)((uint)fVar176 & uVar48 | ~uVar48 & (uint)fVar291);
      fVar77 = (float)((uint)fVar178 & uVar50 | ~uVar50 & (uint)fVar297);
      fVar139 = (float)((uint)fVar136 & uVar47 | ~uVar47 & (uint)fVar305);
      fVar180 = (float)((uint)fVar153 & uVar49 | ~uVar49 & (uint)fVar257);
      fVar191 = (float)((uint)fVar190 & uVar48 | ~uVar48 & (uint)fVar259);
      fVar224 = (float)((uint)fVar233 & uVar50 | ~uVar50 & (uint)fVar261);
      fVar193 = (float)((uint)fVar271 & uVar47 | ~uVar47 & (uint)fVar216);
      fVar214 = (float)((uint)fVar272 & uVar49 | ~uVar49 & (uint)fVar217);
      fVar219 = (float)((uint)fVar273 & uVar48 | ~uVar48 & (uint)fVar295);
      fVar225 = (float)((uint)fVar281 & uVar50 | ~uVar50 & (uint)fVar300);
      fVar282 = (float)((uint)fVar282 & uVar47 | ~uVar47 & (uint)fVar302) - fVar162;
      fVar283 = (float)((uint)fVar283 & uVar49 | ~uVar49 & (uint)fVar227) - fVar174;
      fVar291 = (float)((uint)fVar291 & uVar48 | ~uVar48 & (uint)fVar176) - fVar229;
      fVar297 = (float)((uint)fVar297 & uVar50 | ~uVar50 & (uint)fVar178) - fVar231;
      fVar140 = (float)((uint)fVar305 & uVar47 | ~uVar47 & (uint)fVar136) - fVar228;
      fVar154 = (float)((uint)fVar257 & uVar49 | ~uVar49 & (uint)fVar153) - fVar241;
      fVar157 = (float)((uint)fVar259 & uVar48 | ~uVar48 & (uint)fVar190) - fVar243;
      fVar159 = (float)((uint)fVar261 & uVar50 | ~uVar50 & (uint)fVar233) - fVar244;
      fVar302 = (float)((uint)fVar216 & uVar47 | ~uVar47 & (uint)fVar271) - fVar249;
      fVar227 = (float)((uint)fVar217 & uVar49 | ~uVar49 & (uint)fVar272) - fVar251;
      fVar79 = (float)((uint)fVar295 & uVar48 | ~uVar48 & (uint)fVar273) - fVar262;
      fVar81 = (float)((uint)fVar300 & uVar50 | ~uVar50 & (uint)fVar281) - fVar270;
      fVar289 = fVar162 - fVar307;
      fVar294 = fVar174 - fVar242;
      fVar295 = fVar229 - fVar52;
      fVar299 = fVar231 - fVar77;
      fVar271 = fVar228 - fVar139;
      fVar272 = fVar241 - fVar180;
      fVar273 = fVar243 - fVar191;
      fVar281 = fVar244 - fVar224;
      fVar136 = fVar249 - fVar193;
      fVar153 = fVar251 - fVar214;
      fVar190 = fVar262 - fVar219;
      fVar233 = fVar270 - fVar225;
      fVar176 = (fVar228 * fVar302 - fVar249 * fVar140) * 0.0 +
                (fVar249 * fVar282 - fVar162 * fVar302) * 0.0 +
                (fVar162 * fVar140 - fVar228 * fVar282);
      fVar178 = (fVar241 * fVar227 - fVar251 * fVar154) * 0.0 +
                (fVar251 * fVar283 - fVar174 * fVar227) * 0.0 +
                (fVar174 * fVar154 - fVar241 * fVar283);
      auVar144._4_4_ = fVar178;
      auVar144._0_4_ = fVar176;
      fVar216 = (fVar243 * fVar79 - fVar262 * fVar157) * 0.0 +
                (fVar262 * fVar291 - fVar229 * fVar79) * 0.0 +
                (fVar229 * fVar157 - fVar243 * fVar291);
      fVar217 = (fVar244 * fVar81 - fVar270 * fVar159) * 0.0 +
                (fVar270 * fVar297 - fVar231 * fVar81) * 0.0 +
                (fVar231 * fVar159 - fVar244 * fVar297);
      auVar284._0_4_ =
           (fVar139 * fVar136 - fVar193 * fVar271) * 0.0 +
           (fVar193 * fVar289 - fVar307 * fVar136) * 0.0 + (fVar307 * fVar271 - fVar139 * fVar289);
      auVar284._4_4_ =
           (fVar180 * fVar153 - fVar214 * fVar272) * 0.0 +
           (fVar214 * fVar294 - fVar242 * fVar153) * 0.0 + (fVar242 * fVar272 - fVar180 * fVar294);
      auVar284._8_4_ =
           (fVar191 * fVar190 - fVar219 * fVar273) * 0.0 +
           (fVar219 * fVar295 - fVar52 * fVar190) * 0.0 + (fVar52 * fVar273 - fVar191 * fVar295);
      auVar284._12_4_ =
           (fVar224 * fVar233 - fVar225 * fVar281) * 0.0 +
           (fVar225 * fVar299 - fVar77 * fVar233) * 0.0 + (fVar77 * fVar281 - fVar224 * fVar299);
      auVar144._8_4_ = fVar216;
      auVar144._12_4_ = fVar217;
      auVar53 = maxps(auVar144,auVar284);
      bVar29 = auVar53._0_4_ <= 0.0 && bVar29;
      auVar145._0_4_ = -(uint)bVar29;
      bVar30 = auVar53._4_4_ <= 0.0 && bVar30;
      auVar145._4_4_ = -(uint)bVar30;
      bVar28 = auVar53._8_4_ <= 0.0 && bVar28;
      auVar145._8_4_ = -(uint)bVar28;
      bVar27 = auVar53._12_4_ <= 0.0 && bVar27;
      auVar145._12_4_ = -(uint)bVar27;
      iVar32 = movmskps(iVar32,auVar145);
      if (iVar32 == 0) {
LAB_002e77e9:
        auVar146._8_8_ = uStack_3c0;
        auVar146._0_8_ = local_3c8;
      }
      else {
        auVar168._0_4_ = fVar136 * fVar140;
        auVar168._4_4_ = fVar153 * fVar154;
        auVar168._8_4_ = fVar190 * fVar157;
        auVar168._12_4_ = fVar233 * fVar159;
        fVar307 = fVar271 * fVar302 - auVar168._0_4_;
        fVar242 = fVar272 * fVar227 - auVar168._4_4_;
        fVar52 = fVar273 * fVar79 - auVar168._8_4_;
        fVar77 = fVar281 * fVar81 - auVar168._12_4_;
        fVar136 = fVar136 * fVar282 - fVar302 * fVar289;
        fVar153 = fVar153 * fVar283 - fVar227 * fVar294;
        fVar190 = fVar190 * fVar291 - fVar79 * fVar295;
        fVar233 = fVar233 * fVar297 - fVar81 * fVar299;
        fVar271 = fVar289 * fVar140 - fVar271 * fVar282;
        fVar272 = fVar294 * fVar154 - fVar272 * fVar283;
        fVar273 = fVar295 * fVar157 - fVar273 * fVar291;
        fVar281 = fVar299 * fVar159 - fVar281 * fVar297;
        auVar186._0_4_ = fVar307 * 0.0 + fVar136 * 0.0 + fVar271;
        auVar186._4_4_ = fVar242 * 0.0 + fVar153 * 0.0 + fVar272;
        auVar186._8_4_ = fVar52 * 0.0 + fVar190 * 0.0 + fVar273;
        auVar186._12_4_ = fVar77 * 0.0 + fVar233 * 0.0 + fVar281;
        auVar53 = rcpps(auVar168,auVar186);
        fVar139 = auVar53._0_4_;
        fVar180 = auVar53._4_4_;
        fVar191 = auVar53._8_4_;
        fVar224 = auVar53._12_4_;
        fVar139 = (1.0 - auVar186._0_4_ * fVar139) * fVar139 + fVar139;
        fVar180 = (1.0 - auVar186._4_4_ * fVar180) * fVar180 + fVar180;
        fVar191 = (1.0 - auVar186._8_4_ * fVar191) * fVar191 + fVar191;
        fVar224 = (1.0 - auVar186._12_4_ * fVar224) * fVar224 + fVar224;
        fVar228 = (fVar249 * fVar271 + fVar228 * fVar136 + fVar162 * fVar307) * fVar139;
        fVar153 = (fVar251 * fVar272 + fVar241 * fVar153 + fVar174 * fVar242) * fVar180;
        fVar190 = (fVar262 * fVar273 + fVar243 * fVar190 + fVar229 * fVar52) * fVar191;
        fVar233 = (fVar270 * fVar281 + fVar244 * fVar233 + fVar231 * fVar77) * fVar224;
        fVar136 = *(float *)(ray + k * 4 + 0x80);
        bVar29 = (fVar228 <= fVar136 && fVar156 <= fVar228) && bVar29;
        auVar66._0_4_ = -(uint)bVar29;
        bVar30 = (fVar153 <= fVar136 && fVar156 <= fVar153) && bVar30;
        auVar66._4_4_ = -(uint)bVar30;
        bVar28 = (fVar190 <= fVar136 && fVar156 <= fVar190) && bVar28;
        auVar66._8_4_ = -(uint)bVar28;
        bVar27 = (fVar233 <= fVar136 && fVar156 <= fVar233) && bVar27;
        auVar66._12_4_ = -(uint)bVar27;
        iVar32 = movmskps(iVar32,auVar66);
        if (iVar32 == 0) goto LAB_002e77e9;
        auVar67._0_8_ =
             CONCAT44(-(uint)(auVar186._4_4_ != 0.0 && bVar30),
                      -(uint)(auVar186._0_4_ != 0.0 && bVar29));
        auVar67._8_4_ = -(uint)(auVar186._8_4_ != 0.0 && bVar28);
        auVar67._12_4_ = -(uint)(auVar186._12_4_ != 0.0 && bVar27);
        iVar32 = movmskps(iVar32,auVar67);
        auVar146._8_8_ = uStack_3c0;
        auVar146._0_8_ = local_3c8;
        if (iVar32 != 0) {
          fVar176 = fVar176 * fVar139;
          fVar178 = fVar178 * fVar180;
          fVar216 = fVar216 * fVar191;
          fVar217 = fVar217 * fVar224;
          fVar288 = (float)((uint)(1.0 - fVar176) & uVar47 | ~uVar47 & (uint)fVar176);
          fVar293 = (float)((uint)(1.0 - fVar178) & uVar49 | ~uVar49 & (uint)fVar178);
          fVar298 = (float)((uint)(1.0 - fVar216) & uVar48 | ~uVar48 & (uint)fVar216);
          fVar303 = (float)((uint)(1.0 - fVar217) & uVar50 | ~uVar50 & (uint)fVar217);
          local_238 = (float)(~uVar47 & (uint)(auVar284._0_4_ * fVar139) |
                             (uint)(1.0 - auVar284._0_4_ * fVar139) & uVar47);
          fStack_234 = (float)(~uVar49 & (uint)(auVar284._4_4_ * fVar180) |
                              (uint)(1.0 - auVar284._4_4_ * fVar180) & uVar49);
          fStack_230 = (float)(~uVar48 & (uint)(auVar284._8_4_ * fVar191) |
                              (uint)(1.0 - auVar284._8_4_ * fVar191) & uVar48);
          fStack_22c = (float)(~uVar50 & (uint)(auVar284._12_4_ * fVar224) |
                              (uint)(1.0 - auVar284._12_4_ * fVar224) & uVar50);
          auVar146._8_4_ = auVar67._8_4_;
          auVar146._0_8_ = auVar67._0_8_;
          auVar146._12_4_ = auVar67._12_4_;
          fVar254 = fVar228;
          fVar256 = fVar153;
          fVar258 = fVar190;
          fVar260 = fVar233;
        }
      }
      iVar32 = movmskps(iVar32,auVar146);
      if (iVar32 != 0) {
        fVar139 = (auVar185._0_4_ - auVar267._0_4_) * fVar288 + auVar267._0_4_;
        fVar153 = (auVar185._4_4_ - auVar267._4_4_) * fVar293 + auVar267._4_4_;
        fVar180 = (auVar185._8_4_ - auVar267._8_4_) * fVar298 + auVar267._8_4_;
        fVar190 = (auVar185._12_4_ - auVar267._12_4_) * fVar303 + auVar267._12_4_;
        fVar136 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        valid.field_0.i[0] = -(uint)(fVar136 * (fVar139 + fVar139) < fVar254) & auVar146._0_4_;
        valid.field_0.i[1] = -(uint)(fVar136 * (fVar153 + fVar153) < fVar256) & auVar146._4_4_;
        valid.field_0.i[2] = -(uint)(fVar136 * (fVar180 + fVar180) < fVar258) & auVar146._8_4_;
        valid.field_0.i[3] = -(uint)(fVar136 * (fVar190 + fVar190) < fVar260) & auVar146._12_4_;
        iVar32 = movmskps((int)pre,(undefined1  [16])valid.field_0);
        if (iVar32 != 0) {
          local_238 = local_238 + local_238 + -1.0;
          fStack_234 = fStack_234 + fStack_234 + -1.0;
          fStack_230 = fStack_230 + fStack_230 + -1.0;
          fStack_22c = fStack_22c + fStack_22c + -1.0;
          bhit.i = 0;
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
               CONCAT44(fStack_3a4,local_3a8);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
               CONCAT44(fVar237,fStack_3a0);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
               CONCAT44(fStack_3b4,local_3b8);
          bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
               CONCAT44(fVar238,fStack_3b0);
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_002e77a2;
          fVar156 = 1.0 / fVar76;
          bhit.vu.field_0.v[0] = fVar156 * (fVar288 + 0.0);
          bhit.vu.field_0.v[1] = fVar156 * (fVar293 + 1.0);
          bhit.vu.field_0.v[2] = fVar156 * (fVar298 + 2.0);
          bhit.vu.field_0.v[3] = fVar156 * (fVar303 + 3.0);
          bhit.vv.field_0._0_8_ = CONCAT44(fStack_234,local_238);
          bhit.vv.field_0._8_8_ = CONCAT44(fStack_22c,fStack_230);
          bhit.vt.field_0.v[0] = fVar254;
          bhit.vt.field_0.v[1] = fVar256;
          bhit.vt.field_0.v[2] = fVar258;
          bhit.vt.field_0.v[3] = fVar260;
          auVar104._0_4_ = valid.field_0.i[0] & (uint)fVar254;
          auVar104._4_4_ = valid.field_0.i[1] & (uint)fVar256;
          auVar104._8_4_ = valid.field_0.i[2] & (uint)fVar258;
          auVar104._12_4_ = valid.field_0.i[3] & (uint)fVar260;
          auVar127._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
          auVar127._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
          auVar127._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
          auVar127 = auVar127 | auVar104;
          auVar147._4_4_ = auVar127._0_4_;
          auVar147._0_4_ = auVar127._4_4_;
          auVar147._8_4_ = auVar127._12_4_;
          auVar147._12_4_ = auVar127._8_4_;
          auVar53 = minps(auVar147,auVar127);
          auVar105._0_8_ = auVar53._8_8_;
          auVar105._8_4_ = auVar53._0_4_;
          auVar105._12_4_ = auVar53._4_4_;
          auVar53 = minps(auVar105,auVar53);
          auVar106._0_8_ =
               CONCAT44(-(uint)(auVar53._4_4_ == auVar127._4_4_) & valid.field_0.i[1],
                        -(uint)(auVar53._0_4_ == auVar127._0_4_) & valid.field_0.i[0]);
          auVar106._8_4_ = -(uint)(auVar53._8_4_ == auVar127._8_4_) & valid.field_0.i[2];
          auVar106._12_4_ = -(uint)(auVar53._12_4_ == auVar127._12_4_) & valid.field_0.i[3];
          iVar32 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar106);
          aVar68 = valid.field_0;
          if (iVar32 != 0) {
            aVar68.i[2] = auVar106._8_4_;
            aVar68._0_8_ = auVar106._0_8_;
            aVar68.i[3] = auVar106._12_4_;
          }
          uVar47 = movmskps(iVar32,(undefined1  [16])aVar68);
          lVar34 = 0;
          if (uVar47 != 0) {
            for (; (uVar47 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar156 = bhit.vu.field_0.v[lVar34];
            fVar136 = bhit.vv.field_0.v[lVar34];
            fVar139 = 1.0 - fVar156;
            fVar180 = fVar156 * fVar139 + fVar156 * fVar139;
            fVar153 = fVar139 * fVar139 * -3.0;
            fVar190 = (fVar139 * fVar139 - fVar180) * 3.0;
            fVar139 = (fVar180 - fVar156 * fVar156) * 3.0;
            fVar180 = fVar156 * fVar156 * 3.0;
            *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar34];
            *(float *)(ray + k * 4 + 0xc0) =
                 fVar153 * fVar78 + fVar190 * local_3a8 + fVar139 * local_3b8 + fVar180 * local_398;
            *(float *)(ray + k * 4 + 0xd0) =
                 fVar153 * fVar83 +
                 fVar190 * fStack_3a4 + fVar139 * fStack_3b4 + fVar180 * fStack_394;
            *(float *)(ray + k * 4 + 0xe0) =
                 fVar153 * fVar122 +
                 fVar190 * fStack_3a0 + fVar139 * fStack_3b0 + fVar180 * fStack_390;
            *(float *)(ray + k * 4 + 0xf0) = fVar156;
            *(float *)(ray + k * 4 + 0x100) = fVar136;
            *(uint *)(ray + k * 4 + 0x110) = uVar46;
            *(uint *)(ray + k * 4 + 0x120) = uVar45;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            pRVar39 = (RTCIntersectArguments *)context;
            prim = local_3d8;
            pLVar43 = local_3e0;
          }
          else {
            local_4b8 = CONCAT44(uVar46,uVar46);
            uStack_4b0._0_4_ = uVar46;
            uStack_4b0._4_4_ = uVar46;
            auVar53 = *(undefined1 (*) [16])(mm_lookupmask_ps + lVar38);
            _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            bhit.U.field_0.v[0] = fVar288;
            bhit.U.field_0.v[1] = fVar293;
            bhit.U.field_0.v[2] = fVar298;
            bhit.U.field_0.v[3] = fVar303;
            bhit.V.field_0.v[0] = local_238;
            bhit.V.field_0.v[1] = fStack_234;
            bhit.V.field_0.v[2] = fStack_230;
            bhit.V.field_0.v[3] = fStack_22c;
            bhit.T.field_0.v[0] = fVar254;
            bhit.T.field_0.v[1] = fVar256;
            bhit.T.field_0.v[2] = fVar258;
            bhit.T.field_0.v[3] = fVar260;
            bhit.N = iVar7;
            bhit.valid.field_0 = valid.field_0;
            while( true ) {
              local_e8 = bhit.vu.field_0.v[lVar34];
              local_d8 = bhit.vv.field_0.v[lVar34];
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar34];
              fVar156 = 1.0 - local_e8;
              fVar139 = local_e8 * fVar156 + local_e8 * fVar156;
              fVar153 = (fVar139 - local_e8 * local_e8) * 3.0;
              fVar136 = local_e8 * local_e8 * 3.0;
              fVar139 = (fVar156 * fVar156 - fVar139) * 3.0;
              args.context = context->user;
              fVar156 = fVar156 * fVar156 * -3.0;
              local_118 = fVar156 * fVar78 +
                          fVar139 * local_3a8 + fVar153 * local_3b8 + fVar136 * local_398;
              local_108 = fVar156 * fVar83 +
                          fVar139 * fStack_3a4 + fVar153 * fStack_3b4 + fVar136 * fStack_394;
              local_f8 = fVar156 * fVar122 +
                         fVar139 * fStack_3a0 + fVar153 * fStack_3b0 + fVar136 * fStack_390;
              fStack_114 = local_118;
              fStack_110 = local_118;
              fStack_10c = local_118;
              fStack_104 = local_108;
              fStack_100 = local_108;
              fStack_fc = local_108;
              fStack_f4 = local_f8;
              fStack_f0 = local_f8;
              fStack_ec = local_f8;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              local_c8 = local_4b8;
              uStack_c0 = uStack_4b0;
              local_b8 = CONCAT44(uVar45,uVar45);
              uStack_b0 = CONCAT44(uVar45,uVar45);
              local_a8 = (args.context)->instID[0];
              uStack_a4 = local_a8;
              uStack_a0 = local_a8;
              uStack_9c = local_a8;
              local_98 = (args.context)->instPrimID[0];
              uStack_94 = local_98;
              uStack_90 = local_98;
              uStack_8c = local_98;
              args.valid = (int *)local_3f8;
              pRVar39 = (RTCIntersectArguments *)pGVar8->userPtr;
              args.hit = (RTCHitN *)&local_118;
              args.N = 4;
              p_Var35 = pGVar8->intersectionFilterN;
              local_3f8 = auVar53;
              args.geometryUserPtr = pRVar39;
              args.ray = (RTCRayN *)ray;
              if (p_Var35 != (RTCFilterFunctionN)0x0) {
                p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&args);
              }
              auVar116._0_4_ = -(uint)(local_3f8._0_4_ == 0);
              auVar116._4_4_ = -(uint)(local_3f8._4_4_ == 0);
              auVar116._8_4_ = -(uint)(local_3f8._8_4_ == 0);
              auVar116._12_4_ = -(uint)(local_3f8._12_4_ == 0);
              uVar47 = movmskps((int)p_Var35,auVar116);
              pRVar36 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
              if ((uVar47 ^ 0xf) == 0) {
                auVar116 = auVar116 ^ _DAT_01f46b70;
              }
              else {
                pRVar39 = context->args;
                pRVar37 = (RTCIntersectArguments *)pRVar39->filter;
                if ((pRVar37 != (RTCIntersectArguments *)0x0) &&
                   ((((ulong)*(Scene **)&pRVar39->flags & 2) != 0 ||
                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                  pRVar37 = (RTCIntersectArguments *)(*(code *)pRVar37)(&args);
                }
                auVar73._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                auVar73._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                auVar73._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                auVar73._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                auVar116 = auVar73 ^ _DAT_01f46b70;
                uVar47 = movmskps((int)pRVar37,auVar73);
                pRVar36 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                if ((uVar47 ^ 0xf) != 0) {
                  uVar47 = *(uint *)(args.hit + 4);
                  uVar49 = *(uint *)(args.hit + 8);
                  uVar48 = *(uint *)(args.hit + 0xc);
                  *(uint *)(args.ray + 0xc0) =
                       ~auVar73._0_4_ & *(uint *)args.hit |
                       *(uint *)(args.ray + 0xc0) & auVar73._0_4_;
                  *(uint *)(args.ray + 0xc4) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0xc4) & auVar73._4_4_;
                  *(uint *)(args.ray + 200) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 200) & auVar73._8_4_;
                  *(uint *)(args.ray + 0xcc) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0xcc) & auVar73._12_4_;
                  uVar47 = *(uint *)(args.hit + 0x14);
                  uVar49 = *(uint *)(args.hit + 0x18);
                  uVar48 = *(uint *)(args.hit + 0x1c);
                  *(uint *)(args.ray + 0xd0) =
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x10) |
                       *(uint *)(args.ray + 0xd0) & auVar73._0_4_;
                  *(uint *)(args.ray + 0xd4) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0xd4) & auVar73._4_4_;
                  *(uint *)(args.ray + 0xd8) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 0xd8) & auVar73._8_4_;
                  *(uint *)(args.ray + 0xdc) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0xdc) & auVar73._12_4_;
                  uVar47 = *(uint *)(args.hit + 0x24);
                  uVar49 = *(uint *)(args.hit + 0x28);
                  uVar48 = *(uint *)(args.hit + 0x2c);
                  *(uint *)(args.ray + 0xe0) =
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x20) |
                       *(uint *)(args.ray + 0xe0) & auVar73._0_4_;
                  *(uint *)(args.ray + 0xe4) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0xe4) & auVar73._4_4_;
                  *(uint *)(args.ray + 0xe8) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 0xe8) & auVar73._8_4_;
                  *(uint *)(args.ray + 0xec) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0xec) & auVar73._12_4_;
                  uVar47 = *(uint *)(args.hit + 0x34);
                  uVar49 = *(uint *)(args.hit + 0x38);
                  uVar48 = *(uint *)(args.hit + 0x3c);
                  *(uint *)(args.ray + 0xf0) =
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x30) |
                       *(uint *)(args.ray + 0xf0) & auVar73._0_4_;
                  *(uint *)(args.ray + 0xf4) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0xf4) & auVar73._4_4_;
                  *(uint *)(args.ray + 0xf8) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 0xf8) & auVar73._8_4_;
                  *(uint *)(args.ray + 0xfc) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0xfc) & auVar73._12_4_;
                  uVar47 = *(uint *)(args.hit + 0x44);
                  uVar49 = *(uint *)(args.hit + 0x48);
                  uVar48 = *(uint *)(args.hit + 0x4c);
                  *(uint *)(args.ray + 0x100) =
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x40) |
                       *(uint *)(args.ray + 0x100) & auVar73._0_4_;
                  *(uint *)(args.ray + 0x104) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0x104) & auVar73._4_4_;
                  *(uint *)(args.ray + 0x108) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 0x108) & auVar73._8_4_;
                  *(uint *)(args.ray + 0x10c) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0x10c) & auVar73._12_4_;
                  uVar47 = *(uint *)(args.hit + 0x54);
                  uVar49 = *(uint *)(args.hit + 0x58);
                  uVar48 = *(uint *)(args.hit + 0x5c);
                  *(uint *)(args.ray + 0x110) =
                       *(uint *)(args.ray + 0x110) & auVar73._0_4_ |
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x50);
                  *(uint *)(args.ray + 0x114) =
                       *(uint *)(args.ray + 0x114) & auVar73._4_4_ | ~auVar73._4_4_ & uVar47;
                  *(uint *)(args.ray + 0x118) =
                       *(uint *)(args.ray + 0x118) & auVar73._8_4_ | ~auVar73._8_4_ & uVar49;
                  *(uint *)(args.ray + 0x11c) =
                       *(uint *)(args.ray + 0x11c) & auVar73._12_4_ | ~auVar73._12_4_ & uVar48;
                  uVar47 = *(uint *)(args.hit + 100);
                  uVar49 = *(uint *)(args.hit + 0x68);
                  uVar48 = *(uint *)(args.hit + 0x6c);
                  *(uint *)(args.ray + 0x120) =
                       *(uint *)(args.ray + 0x120) & auVar73._0_4_ |
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x60);
                  *(uint *)(args.ray + 0x124) =
                       *(uint *)(args.ray + 0x124) & auVar73._4_4_ | ~auVar73._4_4_ & uVar47;
                  *(uint *)(args.ray + 0x128) =
                       *(uint *)(args.ray + 0x128) & auVar73._8_4_ | ~auVar73._8_4_ & uVar49;
                  *(uint *)(args.ray + 300) =
                       *(uint *)(args.ray + 300) & auVar73._12_4_ | ~auVar73._12_4_ & uVar48;
                  uVar47 = *(uint *)(args.hit + 0x74);
                  uVar49 = *(uint *)(args.hit + 0x78);
                  uVar48 = *(uint *)(args.hit + 0x7c);
                  *(uint *)(args.ray + 0x130) =
                       ~auVar73._0_4_ & *(uint *)(args.hit + 0x70) |
                       *(uint *)(args.ray + 0x130) & auVar73._0_4_;
                  *(uint *)(args.ray + 0x134) =
                       ~auVar73._4_4_ & uVar47 | *(uint *)(args.ray + 0x134) & auVar73._4_4_;
                  *(uint *)(args.ray + 0x138) =
                       ~auVar73._8_4_ & uVar49 | *(uint *)(args.ray + 0x138) & auVar73._8_4_;
                  *(uint *)(args.ray + 0x13c) =
                       ~auVar73._12_4_ & uVar48 | *(uint *)(args.ray + 0x13c) & auVar73._12_4_;
                  *(undefined1 (*) [16])(args.ray + 0x140) =
                       ~auVar73 & *(undefined1 (*) [16])(args.hit + 0x80) |
                       *(undefined1 (*) [16])(args.ray + 0x140) & auVar73;
                  pRVar36 = args.ray;
                  pRVar39 = (RTCIntersectArguments *)args.hit;
                }
              }
              auVar117._0_4_ = auVar116._0_4_ << 0x1f;
              auVar117._4_4_ = auVar116._4_4_ << 0x1f;
              auVar117._8_4_ = auVar116._8_4_ << 0x1f;
              auVar117._12_4_ = auVar116._12_4_ << 0x1f;
              iVar32 = movmskps((int)pRVar36,auVar117);
              if (iVar32 == 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
              }
              else {
                local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                local_518._4_4_ = 0;
                fStack_510 = 0.0;
                uStack_50c = 0;
              }
              *(undefined4 *)(local_3f8 + lVar34 * 4 + -0x10) = 0;
              valid.field_0.i[0] = -(uint)(fVar254 <= (float)local_518._0_4_) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar256 <= (float)local_518._0_4_) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar258 <= (float)local_518._0_4_) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar260 <= (float)local_518._0_4_) & valid.field_0.i[3];
              iVar32 = movmskps(iVar32,(undefined1  [16])valid.field_0);
              prim = local_3d8;
              pLVar43 = local_3e0;
              if (iVar32 == 0) break;
              auVar118._0_4_ = valid.field_0.i[0] & (uint)fVar254;
              auVar118._4_4_ = valid.field_0.i[1] & (uint)fVar256;
              auVar118._8_4_ = valid.field_0.i[2] & (uint)fVar258;
              auVar118._12_4_ = valid.field_0.i[3] & (uint)fVar260;
              auVar133._0_8_ =
                   CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
              auVar133._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar133._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar133 = auVar133 | auVar118;
              auVar152._4_4_ = auVar133._0_4_;
              auVar152._0_4_ = auVar133._4_4_;
              auVar152._8_4_ = auVar133._12_4_;
              auVar152._12_4_ = auVar133._8_4_;
              auVar183 = minps(auVar152,auVar133);
              auVar119._0_8_ = auVar183._8_8_;
              auVar119._8_4_ = auVar183._0_4_;
              auVar119._12_4_ = auVar183._4_4_;
              auVar183 = minps(auVar119,auVar183);
              auVar120._0_8_ =
                   CONCAT44(-(uint)(auVar183._4_4_ == auVar133._4_4_) & valid.field_0.i[1],
                            -(uint)(auVar183._0_4_ == auVar133._0_4_) & valid.field_0.i[0]);
              auVar120._8_4_ = -(uint)(auVar183._8_4_ == auVar133._8_4_) & valid.field_0.i[2];
              auVar120._12_4_ = -(uint)(auVar183._12_4_ == auVar133._12_4_) & valid.field_0.i[3];
              iVar32 = movmskps(iVar32,auVar120);
              aVar74 = valid.field_0;
              if (iVar32 != 0) {
                aVar74.i[2] = auVar120._8_4_;
                aVar74._0_8_ = auVar120._0_8_;
                aVar74.i[3] = auVar120._12_4_;
              }
              uVar41 = movmskps(iVar32,(undefined1  [16])aVar74);
              uVar33 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar41);
              lVar34 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
            }
          }
        }
        fVar156 = (float)local_388._0_4_;
      }
    }
LAB_002e77a2:
    local_388._0_4_ = fVar156;
    uVar41 = SUB84(pRVar39,0);
    if (4 < iVar7) {
      local_68 = iVar7;
      iStack_64 = iVar7;
      iStack_60 = iVar7;
      iStack_5c = iVar7;
      local_388._4_4_ = local_388._0_4_;
      fStack_380 = (float)local_388._0_4_;
      fStack_37c = (float)local_388._0_4_;
      local_88 = 1.0 / fVar76;
      fStack_84 = local_88;
      fStack_80 = local_88;
      fStack_7c = local_88;
      local_78 = uVar45;
      uStack_74 = uVar45;
      uStack_70 = uVar45;
      uStack_6c = uVar45;
      local_298 = CONCAT44(uVar46,uVar46);
      uStack_290._0_4_ = uVar46;
      uStack_290._4_4_ = uVar46;
      for (lVar34 = 4; uVar41 = SUB84(pRVar39,0), lVar34 < iVar7; lVar34 = lVar34 + 4) {
        bhit.i = (int)lVar34;
        pRVar39 = (RTCIntersectArguments *)(bezier_basis0 + lVar40);
        pauVar4 = (undefined1 (*) [12])((long)&pRVar39->flags + lVar34 * 4);
        fVar156 = *(float *)*pauVar4;
        fVar76 = *(float *)(*pauVar4 + 4);
        fVar136 = *(float *)(*pauVar4 + 8);
        auVar12 = *pauVar4;
        fVar139 = *(float *)pauVar4[1];
        pfVar1 = (float *)(lVar40 + 0x21fb768 + lVar34 * 4);
        fVar153 = *pfVar1;
        fVar180 = pfVar1[1];
        fVar190 = pfVar1[2];
        fVar191 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x21fbbec + lVar34 * 4);
        fVar233 = *pfVar1;
        fVar224 = pfVar1[1];
        fVar228 = pfVar1[2];
        fVar241 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x21fc070 + lVar34 * 4);
        fVar243 = *pfVar1;
        fVar244 = pfVar1[1];
        fVar249 = pfVar1[2];
        fVar251 = pfVar1[3];
        fVar216 = fVar161 * fVar156 + fVar173 * fVar153 + fVar215 * fVar233 + fVar124 * fVar243;
        fVar217 = fVar161 * fVar76 + fVar173 * fVar180 + fVar215 * fVar224 + fVar124 * fVar244;
        fVar219 = fVar161 * fVar136 + fVar173 * fVar190 + fVar215 * fVar228 + fVar124 * fVar249;
        fVar225 = fVar161 * fVar139 + fVar173 * fVar191 + fVar215 * fVar241 + fVar124 * fVar251;
        fVar229 = fVar175 * fVar156 + fVar192 * fVar153 + fVar236 * fVar233 + fVar134 * fVar243;
        fVar289 = fVar175 * fVar76 + fVar192 * fVar180 + fVar236 * fVar224 + fVar134 * fVar244;
        fVar295 = fVar175 * fVar136 + fVar192 * fVar190 + fVar236 * fVar228 + fVar134 * fVar249;
        fVar300 = fVar175 * fVar139 + fVar192 * fVar191 + fVar236 * fVar241 + fVar134 * fVar251;
        fVar52 = fVar123 * fVar156 + fVar237 * fVar153 + fVar238 * fVar233 + local_58 * fVar243;
        fVar77 = fVar123 * fVar76 + fVar237 * fVar180 + fVar238 * fVar224 + fStack_54 * fVar244;
        auVar235._4_4_ = fVar77;
        auVar235._0_4_ = fVar52;
        fVar79 = fVar123 * fVar136 + fVar237 * fVar190 + fVar238 * fVar228 + fStack_50 * fVar249;
        fVar81 = fVar123 * fVar139 + fVar237 * fVar191 + fVar238 * fVar241 + fStack_4c * fVar251;
        pfVar1 = (float *)(bezier_basis1 + lVar40 + lVar34 * 4);
        fVar156 = *pfVar1;
        fVar76 = pfVar1[1];
        fVar136 = pfVar1[2];
        fVar262 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x21fdb88 + lVar34 * 4);
        fVar270 = *pfVar1;
        fVar271 = pfVar1[1];
        fVar272 = pfVar1[2];
        fVar273 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x21fe00c + lVar34 * 4);
        fVar281 = *pfVar1;
        fVar282 = pfVar1[1];
        fVar283 = pfVar1[2];
        fVar291 = pfVar1[3];
        pauVar4 = (undefined1 (*) [12])(lVar40 + 0x21fe490 + lVar34 * 4);
        fVar297 = *(float *)*pauVar4;
        fVar302 = *(float *)(*pauVar4 + 4);
        fVar307 = *(float *)(*pauVar4 + 8);
        auVar13 = *pauVar4;
        fVar227 = *(float *)pauVar4[1];
        fVar140 = fVar161 * fVar156 + fVar173 * fVar270 + fVar215 * fVar281 + fVar124 * fVar297;
        fVar157 = fVar161 * fVar76 + fVar173 * fVar271 + fVar215 * fVar282 + fVar124 * fVar302;
        fVar176 = fVar161 * fVar136 + fVar173 * fVar272 + fVar215 * fVar283 + fVar124 * fVar307;
        fVar193 = fVar161 * fVar262 + fVar173 * fVar273 + fVar215 * fVar291 + fVar124 * fVar227;
        fVar305 = fVar175 * fVar156 + fVar192 * fVar270 + fVar236 * fVar281 + fVar134 * fVar297;
        fVar257 = fVar175 * fVar76 + fVar192 * fVar271 + fVar236 * fVar282 + fVar134 * fVar302;
        fVar259 = fVar175 * fVar136 + fVar192 * fVar272 + fVar236 * fVar283 + fVar134 * fVar307;
        fVar261 = fVar175 * fVar262 + fVar192 * fVar273 + fVar236 * fVar291 + fVar134 * fVar227;
        auVar278._0_4_ =
             fVar123 * fVar156 + fVar237 * fVar270 + fVar238 * fVar281 + local_58 * fVar297;
        auVar278._4_4_ =
             fVar123 * fVar76 + fVar237 * fVar271 + fVar238 * fVar282 + fStack_54 * fVar302;
        auVar278._8_4_ =
             fVar123 * fVar136 + fVar237 * fVar272 + fVar238 * fVar283 + fStack_50 * fVar307;
        auVar278._12_4_ =
             fVar123 * fVar262 + fVar237 * fVar273 + fVar238 * fVar291 + fStack_4c * fVar227;
        fVar154 = fVar140 - fVar216;
        fVar159 = fVar157 - fVar217;
        fVar178 = fVar176 - fVar219;
        fVar214 = fVar193 - fVar225;
        fVar297 = fVar305 - fVar229;
        fVar302 = fVar257 - fVar289;
        fVar307 = fVar259 - fVar295;
        fVar242 = fVar261 - fVar300;
        fVar231 = fVar229 * fVar154 - fVar216 * fVar297;
        fVar294 = fVar289 * fVar159 - fVar217 * fVar302;
        fVar299 = fVar295 * fVar178 - fVar219 * fVar307;
        fVar304 = fVar300 * fVar214 - fVar225 * fVar242;
        auVar235._8_4_ = fVar79;
        auVar235._12_4_ = fVar81;
        auVar53 = maxps(auVar235,auVar278);
        bVar27 = fVar231 * fVar231 <=
                 auVar53._0_4_ * auVar53._0_4_ * (fVar154 * fVar154 + fVar297 * fVar297) &&
                 bhit.i < local_68;
        auVar223._0_4_ = -(uint)bVar27;
        bVar28 = fVar294 * fVar294 <=
                 auVar53._4_4_ * auVar53._4_4_ * (fVar159 * fVar159 + fVar302 * fVar302) &&
                 (int)(bhit.i | 1U) < iStack_64;
        auVar223._4_4_ = -(uint)bVar28;
        bVar29 = fVar299 * fVar299 <=
                 auVar53._8_4_ * auVar53._8_4_ * (fVar178 * fVar178 + fVar307 * fVar307) &&
                 (int)(bhit.i | 2U) < iStack_60;
        auVar223._8_4_ = -(uint)bVar29;
        bVar30 = fVar304 * fVar304 <=
                 auVar53._12_4_ * auVar53._12_4_ * (fVar214 * fVar214 + fVar242 * fVar242) &&
                 (int)(bhit.i | 3U) < iStack_5c;
        auVar223._12_4_ = -(uint)bVar30;
        iVar32 = movmskps(iVar7,auVar223);
        if (iVar32 != 0) {
          local_518._0_4_ = auVar13._0_4_;
          local_518._4_4_ = auVar13._4_4_;
          fStack_510 = auVar13._8_4_;
          fVar137 = (float)local_518._0_4_ * fVar51 + fVar281 * fVar218 + fVar270 * local_378 +
                    fVar156 * fVar213;
          fVar138 = (float)local_518._4_4_ * fVar51 + fVar282 * fVar218 + fVar271 * fStack_374 +
                    fVar76 * fVar213;
          fVar141 = fStack_510 * fVar51 + fVar283 * fVar218 + fVar272 * fStack_370 +
                    fVar136 * fVar213;
          fVar155 = fVar227 * fVar51 + fVar291 * fVar218 + fVar273 * fStack_36c + fVar262 * fVar213;
          local_428 = auVar12._0_4_;
          fStack_424 = auVar12._4_4_;
          fStack_420 = auVar12._8_4_;
          fVar177 = fVar243 * fVar51 + fVar233 * fVar218 + fVar153 * local_378 + local_428 * fVar213
          ;
          fVar179 = fVar244 * fVar51 + fVar224 * fVar218 + fVar180 * fStack_374 +
                    fStack_424 * fVar213;
          fVar220 = fVar249 * fVar51 + fVar228 * fVar218 + fVar190 * fStack_370 +
                    fStack_420 * fVar213;
          fVar226 = fVar251 * fVar51 + fVar241 * fVar218 + fVar191 * fStack_36c + fVar139 * fVar213;
          pfVar1 = (float *)(lVar40 + 0x21fc4f4 + lVar34 * 4);
          fVar156 = *pfVar1;
          fVar76 = pfVar1[1];
          fVar136 = pfVar1[2];
          fVar139 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21fc978 + lVar34 * 4);
          fVar153 = *pfVar1;
          fVar180 = pfVar1[1];
          fVar190 = pfVar1[2];
          fVar191 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21fcdfc + lVar34 * 4);
          fVar233 = *pfVar1;
          fVar224 = pfVar1[1];
          fVar228 = pfVar1[2];
          fVar241 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21fd280 + lVar34 * 4);
          fVar243 = *pfVar1;
          fVar244 = pfVar1[1];
          fVar249 = pfVar1[2];
          fVar251 = pfVar1[3];
          fVar252 = fVar161 * fVar156 + fVar173 * fVar153 + fVar215 * fVar233 + fVar124 * fVar243;
          fVar253 = fVar161 * fVar76 + fVar173 * fVar180 + fVar215 * fVar224 + fVar124 * fVar244;
          fVar290 = fVar161 * fVar136 + fVar173 * fVar190 + fVar215 * fVar228 + fVar124 * fVar249;
          fVar296 = fVar161 * fVar139 + fVar173 * fVar191 + fVar215 * fVar241 + fVar124 * fVar251;
          fVar158 = fVar175 * fVar156 + fVar192 * fVar153 + fVar236 * fVar233 + fVar134 * fVar243;
          fVar160 = fVar175 * fVar76 + fVar192 * fVar180 + fVar236 * fVar224 + fVar134 * fVar244;
          fVar162 = fVar175 * fVar136 + fVar192 * fVar190 + fVar236 * fVar228 + fVar134 * fVar249;
          fVar174 = fVar175 * fVar139 + fVar192 * fVar191 + fVar236 * fVar241 + fVar134 * fVar251;
          pfVar1 = (float *)(lVar40 + 0x21fe914 + lVar34 * 4);
          fVar262 = *pfVar1;
          fVar270 = pfVar1[1];
          fVar271 = pfVar1[2];
          fVar272 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21ff21c + lVar34 * 4);
          fVar273 = *pfVar1;
          fVar281 = pfVar1[1];
          fVar282 = pfVar1[2];
          fVar283 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21ff6a0 + lVar34 * 4);
          fVar291 = *pfVar1;
          fVar227 = pfVar1[1];
          fVar231 = pfVar1[2];
          fVar294 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x21fed98 + lVar34 * 4);
          fVar299 = *pfVar1;
          fVar304 = pfVar1[1];
          fVar125 = pfVar1[2];
          fVar135 = pfVar1[3];
          fVar301 = fVar161 * fVar262 + fVar173 * fVar299 + fVar215 * fVar273 + fVar124 * fVar291;
          fVar306 = fVar161 * fVar270 + fVar173 * fVar304 + fVar215 * fVar281 + fVar124 * fVar227;
          fVar286 = fVar161 * fVar271 + fVar173 * fVar125 + fVar215 * fVar282 + fVar124 * fVar231;
          fVar287 = fVar161 * fVar272 + fVar173 * fVar135 + fVar215 * fVar283 + fVar124 * fVar294;
          fVar230 = fVar175 * fVar262 + fVar192 * fVar299 + fVar236 * fVar273 + fVar134 * fVar291;
          fVar232 = fVar175 * fVar270 + fVar192 * fVar304 + fVar236 * fVar281 + fVar134 * fVar227;
          fVar245 = fVar175 * fVar271 + fVar192 * fVar125 + fVar236 * fVar282 + fVar134 * fVar231;
          fVar250 = fVar175 * fVar272 + fVar192 * fVar135 + fVar236 * fVar283 + fVar134 * fVar294;
          auVar269._0_8_ = CONCAT44(fVar253,fVar252) & 0x7fffffff7fffffff;
          auVar269._8_4_ = ABS(fVar290);
          auVar269._12_4_ = ABS(fVar296);
          auVar187._0_8_ = CONCAT44(fVar160,fVar158) & 0x7fffffff7fffffff;
          auVar187._8_4_ = ABS(fVar162);
          auVar187._12_4_ = ABS(fVar174);
          auVar53 = maxps(auVar269,auVar187);
          auVar279._0_8_ =
               CONCAT44(fVar76 * fVar213 +
                        fVar180 * fStack_374 + fVar224 * fVar218 + fVar244 * fVar51,
                        fVar156 * fVar213 +
                        fVar153 * local_378 + fVar233 * fVar218 + fVar243 * fVar51) &
               0x7fffffff7fffffff;
          auVar279._8_4_ =
               ABS(fVar136 * fVar213 + fVar190 * fStack_370 + fVar228 * fVar218 + fVar249 * fVar51);
          auVar279._12_4_ =
               ABS(fVar139 * fVar213 + fVar191 * fStack_36c + fVar241 * fVar218 + fVar251 * fVar51);
          auVar53 = maxps(auVar53,auVar279);
          uVar45 = -(uint)(local_458 <= auVar53._0_4_);
          uVar47 = -(uint)(local_458 <= auVar53._4_4_);
          uVar49 = -(uint)(local_458 <= auVar53._8_4_);
          uVar48 = -(uint)(local_458 <= auVar53._12_4_);
          auVar188._0_4_ = ~uVar45 & (uint)fVar154;
          auVar188._4_4_ = ~uVar47 & (uint)fVar159;
          auVar188._8_4_ = ~uVar49 & (uint)fVar178;
          auVar188._12_4_ = ~uVar48 & (uint)fVar214;
          auVar255._0_4_ = (uint)fVar252 & uVar45;
          auVar255._4_4_ = (uint)fVar253 & uVar47;
          auVar255._8_4_ = (uint)fVar290 & uVar49;
          auVar255._12_4_ = (uint)fVar296 & uVar48;
          auVar255 = auVar255 | auVar188;
          fVar224 = (float)(~uVar45 & (uint)fVar297 | (uint)fVar158 & uVar45);
          fVar228 = (float)(~uVar47 & (uint)fVar302 | (uint)fVar160 & uVar47);
          fVar241 = (float)(~uVar49 & (uint)fVar307 | (uint)fVar162 & uVar49);
          fVar160 = (float)(~uVar48 & (uint)fVar242 | (uint)fVar174 & uVar48);
          auVar280._0_8_ = CONCAT44(fVar306,fVar301) & 0x7fffffff7fffffff;
          auVar280._8_4_ = ABS(fVar286);
          auVar280._12_4_ = ABS(fVar287);
          auVar128._0_8_ = CONCAT44(fVar232,fVar230) & 0x7fffffff7fffffff;
          auVar128._8_4_ = ABS(fVar245);
          auVar128._12_4_ = ABS(fVar250);
          auVar53 = maxps(auVar280,auVar128);
          auVar69._0_8_ =
               CONCAT44(fVar270 * fVar213 +
                        fVar304 * fStack_374 + fVar281 * fVar218 + fVar227 * fVar51,
                        fVar262 * fVar213 +
                        fVar299 * local_378 + fVar273 * fVar218 + fVar291 * fVar51) &
               0x7fffffff7fffffff;
          auVar69._8_4_ =
               ABS(fVar271 * fVar213 + fVar125 * fStack_370 + fVar282 * fVar218 + fVar231 * fVar51);
          auVar69._12_4_ =
               ABS(fVar272 * fVar213 + fVar135 * fStack_36c + fVar283 * fVar218 + fVar294 * fVar51);
          auVar53 = maxps(auVar53,auVar69);
          uVar45 = -(uint)(local_458 <= auVar53._0_4_);
          uVar47 = -(uint)(local_458 <= auVar53._4_4_);
          uVar49 = -(uint)(local_458 <= auVar53._8_4_);
          uVar48 = -(uint)(local_458 <= auVar53._12_4_);
          fVar291 = (float)((uint)fVar301 & uVar45 | ~uVar45 & (uint)fVar154);
          fVar227 = (float)((uint)fVar306 & uVar47 | ~uVar47 & (uint)fVar159);
          fVar154 = (float)((uint)fVar286 & uVar49 | ~uVar49 & (uint)fVar178);
          fVar159 = (float)((uint)fVar287 & uVar48 | ~uVar48 & (uint)fVar214);
          fVar272 = (float)(~uVar45 & (uint)fVar297 | (uint)fVar230 & uVar45);
          fVar273 = (float)(~uVar47 & (uint)fVar302 | (uint)fVar232 & uVar47);
          fVar281 = (float)(~uVar49 & (uint)fVar307 | (uint)fVar245 & uVar49);
          fVar282 = (float)(~uVar48 & (uint)fVar242 | (uint)fVar250 & uVar48);
          fVar233 = auVar255._0_4_;
          fVar156 = auVar255._4_4_;
          fVar76 = auVar255._8_4_;
          fVar136 = auVar255._12_4_;
          auVar169._0_4_ = fVar224 * fVar224 + fVar233 * fVar233;
          auVar169._4_4_ = fVar228 * fVar228 + fVar156 * fVar156;
          auVar169._8_4_ = fVar241 * fVar241 + fVar76 * fVar76;
          auVar169._12_4_ = fVar160 * fVar160 + fVar136 * fVar136;
          auVar53 = rsqrtps(auVar188,auVar169);
          fVar139 = auVar53._0_4_;
          fVar153 = auVar53._4_4_;
          fVar180 = auVar53._8_4_;
          fVar190 = auVar53._12_4_;
          auVar189._0_4_ = fVar139 * fVar139 * auVar169._0_4_ * 0.5 * fVar139;
          auVar189._4_4_ = fVar153 * fVar153 * auVar169._4_4_ * 0.5 * fVar153;
          auVar189._8_4_ = fVar180 * fVar180 * auVar169._8_4_ * 0.5 * fVar180;
          auVar189._12_4_ = fVar190 * fVar190 * auVar169._12_4_ * 0.5 * fVar190;
          fVar191 = fVar139 * 1.5 - auVar189._0_4_;
          fVar244 = fVar153 * 1.5 - auVar189._4_4_;
          fVar251 = fVar180 * 1.5 - auVar189._8_4_;
          fVar270 = fVar190 * 1.5 - auVar189._12_4_;
          auVar170._0_4_ = fVar272 * fVar272 + fVar291 * fVar291;
          auVar170._4_4_ = fVar273 * fVar273 + fVar227 * fVar227;
          auVar170._8_4_ = fVar281 * fVar281 + fVar154 * fVar154;
          auVar170._12_4_ = fVar282 * fVar282 + fVar159 * fVar159;
          auVar53 = rsqrtps(auVar189,auVar170);
          fVar139 = auVar53._0_4_;
          fVar153 = auVar53._4_4_;
          fVar180 = auVar53._8_4_;
          fVar190 = auVar53._12_4_;
          fVar243 = fVar139 * 1.5 - fVar139 * fVar139 * auVar170._0_4_ * 0.5 * fVar139;
          fVar249 = fVar153 * 1.5 - fVar153 * fVar153 * auVar170._4_4_ * 0.5 * fVar153;
          fVar262 = fVar180 * 1.5 - fVar180 * fVar180 * auVar170._8_4_ * 0.5 * fVar180;
          fVar271 = fVar190 * 1.5 - fVar190 * fVar190 * auVar170._12_4_ * 0.5 * fVar190;
          fVar294 = fVar224 * fVar191 * fVar52;
          fVar125 = fVar228 * fVar244 * fVar77;
          fVar158 = fVar241 * fVar251 * fVar79;
          fVar162 = fVar160 * fVar270 * fVar81;
          fVar233 = -fVar233 * fVar191 * fVar52;
          fVar224 = -fVar156 * fVar244 * fVar77;
          fVar228 = -fVar76 * fVar251 * fVar79;
          fVar241 = -fVar136 * fVar270 * fVar81;
          fVar297 = fVar191 * 0.0 * fVar52;
          fVar307 = fVar244 * 0.0 * fVar77;
          fVar242 = fVar251 * 0.0 * fVar79;
          fVar299 = fVar270 * 0.0 * fVar81;
          fVar230 = fVar272 * fVar243 * auVar278._0_4_;
          fVar232 = fVar273 * fVar249 * auVar278._4_4_;
          fVar245 = fVar281 * fVar262 * auVar278._8_4_;
          fVar250 = fVar282 * fVar271 * auVar278._12_4_;
          fVar273 = fVar140 + fVar230;
          fVar281 = fVar157 + fVar232;
          fVar282 = fVar176 + fVar245;
          fVar283 = fVar193 + fVar250;
          fVar153 = -fVar291 * fVar243 * auVar278._0_4_;
          fVar180 = -fVar227 * fVar249 * auVar278._4_4_;
          fVar190 = -fVar154 * fVar262 * auVar278._8_4_;
          fVar191 = -fVar159 * fVar271 * auVar278._12_4_;
          fVar156 = fVar305 + fVar153;
          fVar76 = fVar257 + fVar180;
          fVar136 = fVar259 + fVar190;
          fVar139 = fVar261 + fVar191;
          fVar244 = fVar243 * 0.0 * auVar278._0_4_;
          fVar251 = fVar249 * 0.0 * auVar278._4_4_;
          fVar270 = fVar262 * 0.0 * auVar278._8_4_;
          fVar272 = fVar271 * 0.0 * auVar278._12_4_;
          fVar291 = fVar216 - fVar294;
          fVar302 = fVar217 - fVar125;
          fVar227 = fVar219 - fVar158;
          fVar154 = fVar225 - fVar162;
          fVar304 = fVar137 + fVar244;
          fVar135 = fVar138 + fVar251;
          fVar160 = fVar141 + fVar270;
          fVar174 = fVar155 + fVar272;
          fVar159 = fVar229 - fVar233;
          fVar178 = fVar289 - fVar224;
          fVar214 = fVar295 - fVar228;
          fVar231 = fVar300 - fVar241;
          fVar243 = fVar177 - fVar297;
          fVar249 = fVar179 - fVar307;
          fVar262 = fVar220 - fVar242;
          fVar271 = fVar226 - fVar299;
          uVar45 = -(uint)(0.0 < (fVar159 * (fVar304 - fVar243) - fVar243 * (fVar156 - fVar159)) *
                                 0.0 + (fVar243 * (fVar273 - fVar291) -
                                       (fVar304 - fVar243) * fVar291) * 0.0 +
                                       ((fVar156 - fVar159) * fVar291 -
                                       (fVar273 - fVar291) * fVar159));
          uVar47 = -(uint)(0.0 < (fVar178 * (fVar135 - fVar249) - fVar249 * (fVar76 - fVar178)) *
                                 0.0 + (fVar249 * (fVar281 - fVar302) -
                                       (fVar135 - fVar249) * fVar302) * 0.0 +
                                       ((fVar76 - fVar178) * fVar302 - (fVar281 - fVar302) * fVar178
                                       ));
          uVar49 = -(uint)(0.0 < (fVar214 * (fVar160 - fVar262) - fVar262 * (fVar136 - fVar214)) *
                                 0.0 + (fVar262 * (fVar282 - fVar227) -
                                       (fVar160 - fVar262) * fVar227) * 0.0 +
                                       ((fVar136 - fVar214) * fVar227 -
                                       (fVar282 - fVar227) * fVar214));
          uVar48 = -(uint)(0.0 < (fVar231 * (fVar174 - fVar271) - fVar271 * (fVar139 - fVar231)) *
                                 0.0 + (fVar271 * (fVar283 - fVar154) -
                                       (fVar174 - fVar271) * fVar154) * 0.0 +
                                       ((fVar139 - fVar231) * fVar154 -
                                       (fVar283 - fVar154) * fVar231));
          fVar294 = (float)((uint)(fVar140 - fVar230) & uVar45 | ~uVar45 & (uint)(fVar216 + fVar294)
                           );
          fVar217 = (float)((uint)(fVar157 - fVar232) & uVar47 | ~uVar47 & (uint)(fVar217 + fVar125)
                           );
          fVar219 = (float)((uint)(fVar176 - fVar245) & uVar49 | ~uVar49 & (uint)(fVar219 + fVar158)
                           );
          fVar225 = (float)((uint)(fVar193 - fVar250) & uVar48 | ~uVar48 & (uint)(fVar225 + fVar162)
                           );
          fVar305 = (float)((uint)(fVar305 - fVar153) & uVar45 | ~uVar45 & (uint)(fVar229 + fVar233)
                           );
          fVar289 = (float)((uint)(fVar257 - fVar180) & uVar47 | ~uVar47 & (uint)(fVar289 + fVar224)
                           );
          fVar295 = (float)((uint)(fVar259 - fVar190) & uVar49 | ~uVar49 & (uint)(fVar295 + fVar228)
                           );
          fVar300 = (float)((uint)(fVar261 - fVar191) & uVar48 | ~uVar48 & (uint)(fVar300 + fVar241)
                           );
          fVar153 = (float)((uint)(fVar137 - fVar244) & uVar45 | ~uVar45 & (uint)(fVar177 + fVar297)
                           );
          fVar180 = (float)((uint)(fVar138 - fVar251) & uVar47 | ~uVar47 & (uint)(fVar179 + fVar307)
                           );
          fVar190 = (float)((uint)(fVar141 - fVar270) & uVar49 | ~uVar49 & (uint)(fVar220 + fVar242)
                           );
          fVar191 = (float)((uint)(fVar155 - fVar272) & uVar48 | ~uVar48 & (uint)(fVar226 + fVar299)
                           );
          fVar297 = (float)((uint)fVar291 & uVar45 | ~uVar45 & (uint)fVar273);
          fVar307 = (float)((uint)fVar302 & uVar47 | ~uVar47 & (uint)fVar281);
          fVar242 = (float)((uint)fVar227 & uVar49 | ~uVar49 & (uint)fVar282);
          fVar140 = (float)((uint)fVar154 & uVar48 | ~uVar48 & (uint)fVar283);
          fVar157 = (float)((uint)fVar159 & uVar45 | ~uVar45 & (uint)fVar156);
          fVar176 = (float)((uint)fVar178 & uVar47 | ~uVar47 & (uint)fVar76);
          fVar193 = (float)((uint)fVar214 & uVar49 | ~uVar49 & (uint)fVar136);
          fVar216 = (float)((uint)fVar231 & uVar48 | ~uVar48 & (uint)fVar139);
          fVar244 = (float)((uint)fVar243 & uVar45 | ~uVar45 & (uint)fVar304);
          fVar251 = (float)((uint)fVar249 & uVar47 | ~uVar47 & (uint)fVar135);
          fVar270 = (float)((uint)fVar262 & uVar49 | ~uVar49 & (uint)fVar160);
          fVar272 = (float)((uint)fVar271 & uVar48 | ~uVar48 & (uint)fVar174);
          fVar273 = (float)((uint)fVar273 & uVar45 | ~uVar45 & (uint)fVar291) - fVar294;
          fVar281 = (float)((uint)fVar281 & uVar47 | ~uVar47 & (uint)fVar302) - fVar217;
          fVar282 = (float)((uint)fVar282 & uVar49 | ~uVar49 & (uint)fVar227) - fVar219;
          fVar283 = (float)((uint)fVar283 & uVar48 | ~uVar48 & (uint)fVar154) - fVar225;
          fVar291 = (float)((uint)fVar156 & uVar45 | ~uVar45 & (uint)fVar159) - fVar305;
          fVar302 = (float)((uint)fVar76 & uVar47 | ~uVar47 & (uint)fVar178) - fVar289;
          fVar227 = (float)((uint)fVar136 & uVar49 | ~uVar49 & (uint)fVar214) - fVar295;
          fVar154 = (float)((uint)fVar139 & uVar48 | ~uVar48 & (uint)fVar231) - fVar300;
          fVar243 = (float)((uint)fVar304 & uVar45 | ~uVar45 & (uint)fVar243) - fVar153;
          fVar249 = (float)((uint)fVar135 & uVar47 | ~uVar47 & (uint)fVar249) - fVar180;
          fVar262 = (float)((uint)fVar160 & uVar49 | ~uVar49 & (uint)fVar262) - fVar190;
          fVar271 = (float)((uint)fVar174 & uVar48 | ~uVar48 & (uint)fVar271) - fVar191;
          fVar231 = fVar294 - fVar297;
          fVar299 = fVar217 - fVar307;
          fVar304 = fVar219 - fVar242;
          fVar257 = fVar225 - fVar140;
          fVar156 = fVar305 - fVar157;
          fVar76 = fVar289 - fVar176;
          fVar136 = fVar295 - fVar193;
          fVar139 = fVar300 - fVar216;
          fVar233 = fVar153 - fVar244;
          fVar224 = fVar180 - fVar251;
          fVar228 = fVar190 - fVar270;
          fVar241 = fVar191 - fVar272;
          fVar159 = (fVar305 * fVar243 - fVar153 * fVar291) * 0.0 +
                    (fVar153 * fVar273 - fVar294 * fVar243) * 0.0 +
                    (fVar294 * fVar291 - fVar305 * fVar273);
          fVar178 = (fVar289 * fVar249 - fVar180 * fVar302) * 0.0 +
                    (fVar180 * fVar281 - fVar217 * fVar249) * 0.0 +
                    (fVar217 * fVar302 - fVar289 * fVar281);
          auVar148._4_4_ = fVar178;
          auVar148._0_4_ = fVar159;
          fVar214 = (fVar295 * fVar262 - fVar190 * fVar227) * 0.0 +
                    (fVar190 * fVar282 - fVar219 * fVar262) * 0.0 +
                    (fVar219 * fVar227 - fVar295 * fVar282);
          fVar229 = (fVar300 * fVar271 - fVar191 * fVar154) * 0.0 +
                    (fVar191 * fVar283 - fVar225 * fVar271) * 0.0 +
                    (fVar225 * fVar154 - fVar300 * fVar283);
          auVar285._0_4_ =
               (fVar157 * fVar233 - fVar244 * fVar156) * 0.0 +
               (fVar244 * fVar231 - fVar297 * fVar233) * 0.0 +
               (fVar297 * fVar156 - fVar157 * fVar231);
          auVar285._4_4_ =
               (fVar176 * fVar224 - fVar251 * fVar76) * 0.0 +
               (fVar251 * fVar299 - fVar307 * fVar224) * 0.0 +
               (fVar307 * fVar76 - fVar176 * fVar299);
          auVar285._8_4_ =
               (fVar193 * fVar228 - fVar270 * fVar136) * 0.0 +
               (fVar270 * fVar304 - fVar242 * fVar228) * 0.0 +
               (fVar242 * fVar136 - fVar193 * fVar304);
          auVar285._12_4_ =
               (fVar216 * fVar241 - fVar272 * fVar139) * 0.0 +
               (fVar272 * fVar257 - fVar140 * fVar241) * 0.0 +
               (fVar140 * fVar139 - fVar216 * fVar257);
          auVar148._8_4_ = fVar214;
          auVar148._12_4_ = fVar229;
          auVar53 = maxps(auVar148,auVar285);
          bVar27 = auVar53._0_4_ <= 0.0 && bVar27;
          auVar149._0_4_ = -(uint)bVar27;
          bVar28 = auVar53._4_4_ <= 0.0 && bVar28;
          auVar149._4_4_ = -(uint)bVar28;
          bVar29 = auVar53._8_4_ <= 0.0 && bVar29;
          auVar149._8_4_ = -(uint)bVar29;
          bVar30 = auVar53._12_4_ <= 0.0 && bVar30;
          auVar149._12_4_ = -(uint)bVar30;
          iVar32 = movmskps((int)(bezier_basis1 + lVar40),auVar149);
          if (iVar32 == 0) {
LAB_002e8577:
            iVar32 = 0;
            auVar130._8_8_ = uStack_3c0;
            auVar130._0_8_ = local_3c8;
          }
          else {
            fVar244 = fVar156 * fVar243 - fVar233 * fVar291;
            fVar251 = fVar76 * fVar249 - fVar224 * fVar302;
            fVar270 = fVar136 * fVar262 - fVar228 * fVar227;
            fVar272 = fVar139 * fVar271 - fVar241 * fVar154;
            fVar243 = fVar233 * fVar273 - fVar243 * fVar231;
            fVar224 = fVar224 * fVar281 - fVar249 * fVar299;
            fVar228 = fVar228 * fVar282 - fVar262 * fVar304;
            fVar241 = fVar241 * fVar283 - fVar271 * fVar257;
            fVar156 = fVar231 * fVar291 - fVar156 * fVar273;
            fVar249 = fVar299 * fVar302 - fVar76 * fVar281;
            fVar262 = fVar304 * fVar227 - fVar136 * fVar282;
            fVar271 = fVar257 * fVar154 - fVar139 * fVar283;
            auVar129._0_4_ = fVar243 * 0.0 + fVar156;
            auVar129._4_4_ = fVar224 * 0.0 + fVar249;
            auVar129._8_4_ = fVar228 * 0.0 + fVar262;
            auVar129._12_4_ = fVar241 * 0.0 + fVar271;
            auVar212._0_4_ = fVar244 * 0.0 + auVar129._0_4_;
            auVar212._4_4_ = fVar251 * 0.0 + auVar129._4_4_;
            auVar212._8_4_ = fVar270 * 0.0 + auVar129._8_4_;
            auVar212._12_4_ = fVar272 * 0.0 + auVar129._12_4_;
            auVar53 = rcpps(auVar129,auVar212);
            fVar76 = auVar53._0_4_;
            fVar136 = auVar53._4_4_;
            fVar139 = auVar53._8_4_;
            fVar233 = auVar53._12_4_;
            fVar76 = (1.0 - auVar212._0_4_ * fVar76) * fVar76 + fVar76;
            fVar136 = (1.0 - auVar212._4_4_ * fVar136) * fVar136 + fVar136;
            fVar139 = (1.0 - auVar212._8_4_ * fVar139) * fVar139 + fVar139;
            fVar233 = (1.0 - auVar212._12_4_ * fVar233) * fVar233 + fVar233;
            fVar153 = (fVar153 * fVar156 + fVar305 * fVar243 + fVar294 * fVar244) * fVar76;
            fVar180 = (fVar180 * fVar249 + fVar289 * fVar224 + fVar217 * fVar251) * fVar136;
            fVar190 = (fVar190 * fVar262 + fVar295 * fVar228 + fVar219 * fVar270) * fVar139;
            fVar191 = (fVar191 * fVar271 + fVar300 * fVar241 + fVar225 * fVar272) * fVar233;
            fVar156 = *(float *)(ray + k * 4 + 0x80);
            bVar27 = ((float)local_388._0_4_ <= fVar153 && fVar153 <= fVar156) && bVar27;
            auVar171._0_4_ = -(uint)bVar27;
            bVar28 = ((float)local_388._4_4_ <= fVar180 && fVar180 <= fVar156) && bVar28;
            auVar171._4_4_ = -(uint)bVar28;
            bVar29 = (fStack_380 <= fVar190 && fVar190 <= fVar156) && bVar29;
            auVar171._8_4_ = -(uint)bVar29;
            bVar30 = (fStack_37c <= fVar191 && fVar191 <= fVar156) && bVar30;
            auVar171._12_4_ = -(uint)bVar30;
            iVar32 = movmskps(iVar32,auVar171);
            if (iVar32 == 0) goto LAB_002e8577;
            auVar172._0_8_ =
                 CONCAT44(-(uint)(auVar212._4_4_ != 0.0 && bVar28),
                          -(uint)(auVar212._0_4_ != 0.0 && bVar27));
            auVar172._8_4_ = -(uint)(auVar212._8_4_ != 0.0 && bVar29);
            auVar172._12_4_ = -(uint)(auVar212._12_4_ != 0.0 && bVar30);
            iVar32 = movmskps(iVar32,auVar172);
            auVar130._8_8_ = uStack_3c0;
            auVar130._0_8_ = local_3c8;
            if (iVar32 != 0) {
              fVar159 = fVar159 * fVar76;
              fVar178 = fVar178 * fVar136;
              fVar214 = fVar214 * fVar139;
              fVar229 = fVar229 * fVar233;
              local_4c8 = (float)((uint)(1.0 - fVar159) & uVar45 | ~uVar45 & (uint)fVar159);
              fStack_4c4 = (float)((uint)(1.0 - fVar178) & uVar47 | ~uVar47 & (uint)fVar178);
              fStack_4c0 = (float)((uint)(1.0 - fVar214) & uVar49 | ~uVar49 & (uint)fVar214);
              fStack_4bc = (float)((uint)(1.0 - fVar229) & uVar48 | ~uVar48 & (uint)fVar229);
              local_248 = (float)(~uVar45 & (uint)(auVar285._0_4_ * fVar76) |
                                 (uint)(1.0 - auVar285._0_4_ * fVar76) & uVar45);
              fStack_244 = (float)(~uVar47 & (uint)(auVar285._4_4_ * fVar136) |
                                  (uint)(1.0 - auVar285._4_4_ * fVar136) & uVar47);
              fStack_240 = (float)(~uVar49 & (uint)(auVar285._8_4_ * fVar139) |
                                  (uint)(1.0 - auVar285._8_4_ * fVar139) & uVar49);
              fStack_23c = (float)(~uVar48 & (uint)(auVar285._12_4_ * fVar233) |
                                  (uint)(1.0 - auVar285._12_4_ * fVar233) & uVar48);
              auVar130._8_4_ = auVar172._8_4_;
              auVar130._0_8_ = auVar172._0_8_;
              auVar130._12_4_ = auVar172._12_4_;
              local_338 = fVar153;
              fStack_334 = fVar180;
              fStack_330 = fVar190;
              fStack_32c = fVar191;
            }
          }
          iVar32 = movmskps(iVar32,auVar130);
          if (iVar32 != 0) {
            fVar52 = (auVar278._0_4_ - fVar52) * local_4c8 + fVar52;
            fVar77 = (auVar278._4_4_ - fVar77) * fStack_4c4 + fVar77;
            fVar79 = (auVar278._8_4_ - fVar79) * fStack_4c0 + fVar79;
            fVar81 = (auVar278._12_4_ - fVar81) * fStack_4bc + fVar81;
            fVar156 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            valid.field_0.i[0] = -(uint)(fVar156 * (fVar52 + fVar52) < local_338) & auVar130._0_4_;
            valid.field_0.i[1] = -(uint)(fVar156 * (fVar77 + fVar77) < fStack_334) & auVar130._4_4_;
            valid.field_0.i[2] = -(uint)(fVar156 * (fVar79 + fVar79) < fStack_330) & auVar130._8_4_;
            valid.field_0.i[3] = -(uint)(fVar156 * (fVar81 + fVar81) < fStack_32c) & auVar130._12_4_
            ;
            iVar32 = movmskps((int)pre,(undefined1  [16])valid.field_0);
            if (iVar32 != 0) {
              local_248 = local_248 + local_248 + -1.0;
              fStack_244 = fStack_244 + fStack_244 + -1.0;
              fStack_240 = fStack_240 + fStack_240 + -1.0;
              fStack_23c = fStack_23c + fStack_23c + -1.0;
              bhit.U.field_0.v[0] = local_4c8;
              bhit.U.field_0.v[1] = fStack_4c4;
              bhit.U.field_0.v[2] = fStack_4c0;
              bhit.U.field_0.v[3] = fStack_4bc;
              bhit.T.field_0.v[0] = local_338;
              bhit.T.field_0.v[1] = fStack_334;
              bhit.T.field_0.v[2] = fStack_330;
              bhit.T.field_0.v[3] = fStack_32c;
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._0_8_ =
                   CONCAT44(fStack_3a4,local_3a8);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v1.field_0._8_8_ =
                   CONCAT44(fStack_39c,fStack_3a0);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._0_8_ =
                   CONCAT44(fStack_3b4,local_3b8);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v2.field_0._8_8_ =
                   CONCAT44(fStack_3ac,fStack_3b0);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._0_8_ =
                   CONCAT44(fStack_394,local_398);
              bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v3.field_0._8_8_ =
                   CONCAT44(fStack_38c,fStack_390);
              pGVar8 = (context->scene->geometries).items[(long)local_3d0].ptr;
              pRVar39 = local_3d0;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar156 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar156 + local_4c8 + 0.0) * local_88;
                bhit.vu.field_0.v[1] = (fVar156 + fStack_4c4 + 1.0) * fStack_84;
                bhit.vu.field_0.v[2] = (fVar156 + fStack_4c0 + 2.0) * fStack_80;
                bhit.vu.field_0.v[3] = (fVar156 + fStack_4bc + 3.0) * fStack_7c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_244,local_248);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_23c,fStack_240);
                bhit.vt.field_0.v[0] = local_338;
                bhit.vt.field_0.v[1] = fStack_334;
                bhit.vt.field_0.v[2] = fStack_330;
                bhit.vt.field_0.v[3] = fStack_32c;
                auVar108._0_4_ = valid.field_0.i[0] & (uint)local_338;
                auVar108._4_4_ = valid.field_0.i[1] & (uint)fStack_334;
                auVar108._8_4_ = valid.field_0.i[2] & (uint)fStack_330;
                auVar108._12_4_ = valid.field_0.i[3] & (uint)fStack_32c;
                auVar131._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar131._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar131._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar131 = auVar131 | auVar108;
                auVar150._4_4_ = auVar131._0_4_;
                auVar150._0_4_ = auVar131._4_4_;
                auVar150._8_4_ = auVar131._12_4_;
                auVar150._12_4_ = auVar131._8_4_;
                auVar53 = minps(auVar150,auVar131);
                auVar109._0_8_ = auVar53._8_8_;
                auVar109._8_4_ = auVar53._0_4_;
                auVar109._12_4_ = auVar53._4_4_;
                auVar53 = minps(auVar109,auVar53);
                auVar110._0_8_ =
                     CONCAT44(-(uint)(auVar53._4_4_ == auVar131._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar53._0_4_ == auVar131._0_4_) & valid.field_0.i[0]);
                auVar110._8_4_ = -(uint)(auVar53._8_4_ == auVar131._8_4_) & valid.field_0.i[2];
                auVar110._12_4_ = -(uint)(auVar53._12_4_ == auVar131._12_4_) & valid.field_0.i[3];
                iVar32 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar110);
                aVar70 = valid.field_0;
                if (iVar32 != 0) {
                  aVar70.i[2] = auVar110._8_4_;
                  aVar70._0_8_ = auVar110._0_8_;
                  aVar70.i[3] = auVar110._12_4_;
                }
                uVar45 = movmskps(iVar32,(undefined1  [16])aVar70);
                lVar44 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar156 = bhit.vu.field_0.v[lVar44];
                  fVar76 = bhit.vv.field_0.v[lVar44];
                  fVar136 = 1.0 - fVar156;
                  fVar153 = fVar156 * fVar136 + fVar156 * fVar136;
                  fVar139 = fVar136 * fVar136 * -3.0;
                  fVar180 = (fVar136 * fVar136 - fVar153) * 3.0;
                  fVar136 = (fVar153 - fVar156 * fVar156) * 3.0;
                  fVar153 = fVar156 * fVar156 * 3.0;
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar44];
                  *(float *)(ray + k * 4 + 0xc0) =
                       fVar139 * fVar78 +
                       fVar180 * local_3a8 + fVar136 * local_3b8 + fVar153 * local_398;
                  *(float *)(ray + k * 4 + 0xd0) =
                       fVar139 * fVar83 +
                       fVar180 * fStack_3a4 + fVar136 * fStack_3b4 + fVar153 * fStack_394;
                  *(float *)(ray + k * 4 + 0xe0) =
                       fVar139 * fVar122 +
                       fVar180 * fStack_3a0 + fVar136 * fStack_3b0 + fVar153 * fStack_390;
                  *(float *)(ray + k * 4 + 0xf0) = fVar156;
                  *(float *)(ray + k * 4 + 0x100) = fVar76;
                  *(uint *)(ray + k * 4 + 0x110) = uVar46;
                  *(int *)(ray + k * 4 + 0x120) = (int)local_3d0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  pRVar39 = (RTCIntersectArguments *)context;
                  prim = local_3d8;
                  pLVar43 = local_3e0;
                }
                else {
                  auVar12 = *(undefined1 (*) [12])*(undefined1 (*) [16])(mm_lookupmask_ps + lVar38);
                  uStack_51c = (undefined4)
                               ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar38 + 8) >> 0x20);
                  _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  bhit.V.field_0.v[0] = local_248;
                  bhit.V.field_0.v[1] = fStack_244;
                  bhit.V.field_0.v[2] = fStack_240;
                  bhit.V.field_0.v[3] = fStack_23c;
                  bhit.N = iVar7;
                  bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._0_8_ = uVar9;
                  bhit.curve3D.super_BezierCurveT<embree::Vec3fx>.v0.field_0._8_8_ = uVar31;
                  bhit.valid.field_0 = valid.field_0;
                  while( true ) {
                    local_e8 = bhit.vu.field_0.v[lVar44];
                    local_d8 = bhit.vv.field_0.v[lVar44];
                    *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar44];
                    fVar156 = 1.0 - local_e8;
                    fVar136 = local_e8 * fVar156 + local_e8 * fVar156;
                    fVar139 = (fVar136 - local_e8 * local_e8) * 3.0;
                    fVar76 = local_e8 * local_e8 * 3.0;
                    fVar136 = (fVar156 * fVar156 - fVar136) * 3.0;
                    args.context = context->user;
                    fVar156 = fVar156 * fVar156 * -3.0;
                    local_118 = fVar156 * fVar78 +
                                fVar136 * local_3a8 + fVar139 * local_3b8 + fVar76 * local_398;
                    local_108 = fVar156 * fVar83 +
                                fVar136 * fStack_3a4 + fVar139 * fStack_3b4 + fVar76 * fStack_394;
                    local_f8 = fVar156 * fVar122 +
                               fVar136 * fStack_3a0 + fVar139 * fStack_3b0 + fVar76 * fStack_390;
                    fStack_114 = local_118;
                    fStack_110 = local_118;
                    fStack_10c = local_118;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_c8 = local_298;
                    uStack_c0 = uStack_290;
                    local_b8 = CONCAT44(uStack_74,local_78);
                    uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                    local_a8 = (args.context)->instID[0];
                    uStack_a4 = local_a8;
                    uStack_a0 = local_a8;
                    uStack_9c = local_a8;
                    local_98 = (args.context)->instPrimID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_3f8._12_4_ = uStack_51c;
                    local_3f8._0_12_ = auVar12;
                    args.valid = (int *)local_3f8;
                    pRVar39 = (RTCIntersectArguments *)pGVar8->userPtr;
                    args.hit = (RTCHitN *)&local_118;
                    args.N = 4;
                    p_Var35 = pGVar8->intersectionFilterN;
                    args.geometryUserPtr = pRVar39;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var35 != (RTCFilterFunctionN)0x0) {
                      p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&args);
                    }
                    auVar111._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                    auVar111._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                    auVar111._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                    auVar111._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                    uVar45 = movmskps((int)p_Var35,auVar111);
                    pRVar36 = (RTCRayN *)(ulong)(uVar45 ^ 0xf);
                    if ((uVar45 ^ 0xf) == 0) {
                      auVar111 = auVar111 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar39 = context->args;
                      pRVar37 = (RTCIntersectArguments *)pRVar39->filter;
                      if ((pRVar37 != (RTCIntersectArguments *)0x0) &&
                         ((((ulong)*(Scene **)&pRVar39->flags & 2) != 0 ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar37 = (RTCIntersectArguments *)(*(code *)pRVar37)(&args);
                      }
                      auVar71._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                      auVar71._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                      auVar71._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                      auVar71._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                      auVar111 = auVar71 ^ _DAT_01f46b70;
                      uVar45 = movmskps((int)pRVar37,auVar71);
                      pRVar36 = (RTCRayN *)(ulong)(uVar45 ^ 0xf);
                      if ((uVar45 ^ 0xf) != 0) {
                        uVar45 = *(uint *)(args.hit + 4);
                        uVar47 = *(uint *)(args.hit + 8);
                        uVar49 = *(uint *)(args.hit + 0xc);
                        *(uint *)(args.ray + 0xc0) =
                             ~auVar71._0_4_ & *(uint *)args.hit |
                             *(uint *)(args.ray + 0xc0) & auVar71._0_4_;
                        *(uint *)(args.ray + 0xc4) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0xc4) & auVar71._4_4_;
                        *(uint *)(args.ray + 200) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 200) & auVar71._8_4_;
                        *(uint *)(args.ray + 0xcc) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0xcc) & auVar71._12_4_;
                        uVar45 = *(uint *)(args.hit + 0x14);
                        uVar47 = *(uint *)(args.hit + 0x18);
                        uVar49 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar71._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0xd4) & auVar71._4_4_;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 0xd8) & auVar71._8_4_;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0xdc) & auVar71._12_4_;
                        uVar45 = *(uint *)(args.hit + 0x24);
                        uVar47 = *(uint *)(args.hit + 0x28);
                        uVar49 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar71._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0xe4) & auVar71._4_4_;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 0xe8) & auVar71._8_4_;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0xec) & auVar71._12_4_;
                        uVar45 = *(uint *)(args.hit + 0x34);
                        uVar47 = *(uint *)(args.hit + 0x38);
                        uVar49 = *(uint *)(args.hit + 0x3c);
                        *(uint *)(args.ray + 0xf0) =
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x30) |
                             *(uint *)(args.ray + 0xf0) & auVar71._0_4_;
                        *(uint *)(args.ray + 0xf4) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0xf4) & auVar71._4_4_;
                        *(uint *)(args.ray + 0xf8) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 0xf8) & auVar71._8_4_;
                        *(uint *)(args.ray + 0xfc) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0xfc) & auVar71._12_4_;
                        uVar45 = *(uint *)(args.hit + 0x44);
                        uVar47 = *(uint *)(args.hit + 0x48);
                        uVar49 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar71._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0x104) & auVar71._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 0x108) & auVar71._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0x10c) & auVar71._12_4_
                        ;
                        uVar45 = *(uint *)(args.hit + 0x54);
                        uVar47 = *(uint *)(args.hit + 0x58);
                        uVar49 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar71._0_4_ |
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar71._4_4_ | ~auVar71._4_4_ & uVar45;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar71._8_4_ | ~auVar71._8_4_ & uVar47;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar71._12_4_ | ~auVar71._12_4_ & uVar49
                        ;
                        uVar45 = *(uint *)(args.hit + 100);
                        uVar47 = *(uint *)(args.hit + 0x68);
                        uVar49 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar71._0_4_ |
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar71._4_4_ | ~auVar71._4_4_ & uVar45;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar71._8_4_ | ~auVar71._8_4_ & uVar47;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar71._12_4_ | ~auVar71._12_4_ & uVar49;
                        uVar45 = *(uint *)(args.hit + 0x74);
                        uVar47 = *(uint *)(args.hit + 0x78);
                        uVar49 = *(uint *)(args.hit + 0x7c);
                        *(uint *)(args.ray + 0x130) =
                             ~auVar71._0_4_ & *(uint *)(args.hit + 0x70) |
                             *(uint *)(args.ray + 0x130) & auVar71._0_4_;
                        *(uint *)(args.ray + 0x134) =
                             ~auVar71._4_4_ & uVar45 | *(uint *)(args.ray + 0x134) & auVar71._4_4_;
                        *(uint *)(args.ray + 0x138) =
                             ~auVar71._8_4_ & uVar47 | *(uint *)(args.ray + 0x138) & auVar71._8_4_;
                        *(uint *)(args.ray + 0x13c) =
                             ~auVar71._12_4_ & uVar49 | *(uint *)(args.ray + 0x13c) & auVar71._12_4_
                        ;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar71 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar71;
                        pRVar36 = args.ray;
                        pRVar39 = (RTCIntersectArguments *)args.hit;
                      }
                    }
                    auVar112._0_4_ = auVar111._0_4_ << 0x1f;
                    auVar112._4_4_ = auVar111._4_4_ << 0x1f;
                    auVar112._8_4_ = auVar111._8_4_ << 0x1f;
                    auVar112._12_4_ = auVar111._12_4_ << 0x1f;
                    iVar32 = movmskps((int)pRVar36,auVar112);
                    if (iVar32 == 0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                    }
                    else {
                      local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_518._4_4_ = 0;
                      fStack_510 = 0.0;
                      uStack_50c = 0;
                    }
                    *(undefined4 *)(local_3f8 + lVar44 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(local_338 <= (float)local_518._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fStack_334 <= (float)local_518._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fStack_330 <= (float)local_518._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fStack_32c <= (float)local_518._0_4_) & valid.field_0.i[3];
                    iVar32 = movmskps(iVar32,(undefined1  [16])valid.field_0);
                    prim = local_3d8;
                    pLVar43 = local_3e0;
                    if (iVar32 == 0) break;
                    auVar113._0_4_ = valid.field_0.i[0] & (uint)local_338;
                    auVar113._4_4_ = valid.field_0.i[1] & (uint)fStack_334;
                    auVar113._8_4_ = valid.field_0.i[2] & (uint)fStack_330;
                    auVar113._12_4_ = valid.field_0.i[3] & (uint)fStack_32c;
                    auVar132._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar132._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar132._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar132 = auVar132 | auVar113;
                    auVar151._4_4_ = auVar132._0_4_;
                    auVar151._0_4_ = auVar132._4_4_;
                    auVar151._8_4_ = auVar132._12_4_;
                    auVar151._12_4_ = auVar132._8_4_;
                    auVar53 = minps(auVar151,auVar132);
                    auVar114._0_8_ = auVar53._8_8_;
                    auVar114._8_4_ = auVar53._0_4_;
                    auVar114._12_4_ = auVar53._4_4_;
                    auVar53 = minps(auVar114,auVar53);
                    auVar115._0_8_ =
                         CONCAT44(-(uint)(auVar53._4_4_ == auVar132._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar53._0_4_ == auVar132._0_4_) & valid.field_0.i[0]);
                    auVar115._8_4_ = -(uint)(auVar53._8_4_ == auVar132._8_4_) & valid.field_0.i[2];
                    auVar115._12_4_ =
                         -(uint)(auVar53._12_4_ == auVar132._12_4_) & valid.field_0.i[3];
                    iVar32 = movmskps(iVar32,auVar115);
                    aVar72 = valid.field_0;
                    if (iVar32 != 0) {
                      aVar72.i[2] = auVar115._8_4_;
                      aVar72._0_8_ = auVar115._0_8_;
                      aVar72.i[3] = auVar115._12_4_;
                    }
                    uVar41 = movmskps(iVar32,(undefined1  [16])aVar72);
                    uVar33 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar41);
                    lVar44 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fVar156 = *(float *)(ray + k * 4 + 0x80);
    auVar107._4_4_ = -(uint)(fStack_44 <= fVar156);
    auVar107._0_4_ = -(uint)(local_48 <= fVar156);
    auVar107._8_4_ = -(uint)(fStack_40 <= fVar156);
    auVar107._12_4_ = -(uint)(fStack_3c <= fVar156);
    uVar45 = movmskps(uVar41,auVar107);
    uVar42 = (ulong)((uint)uVar42 & (uint)uVar42 + 0xf & uVar45);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }